

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCRayQueryFlags *pRVar7;
  Primitive *pPVar8;
  undefined1 (*pauVar9) [12];
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Primitive PVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [16];
  undefined6 uVar62;
  undefined1 auVar63 [12];
  unkbyte9 Var64;
  undefined1 auVar65 [13];
  undefined1 auVar66 [12];
  undefined1 auVar67 [13];
  undefined1 auVar68 [12];
  undefined1 auVar69 [13];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [13];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  bool bVar90;
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  bool bVar95;
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  bool bVar100;
  bool bVar101;
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [13];
  undefined1 auVar119 [13];
  undefined1 auVar120 [13];
  undefined1 auVar121 [13];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  ulong uVar126;
  RTCFilterFunctionN p_Var127;
  RTCRayN *pRVar128;
  long lVar129;
  RTCIntersectArguments *pRVar130;
  ulong uVar131;
  long lVar132;
  undefined4 uVar133;
  undefined8 unaff_RBP;
  ulong uVar135;
  byte bVar136;
  long lVar137;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  short sVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar149 [12];
  float fVar205;
  undefined1 auVar154 [16];
  char cVar213;
  undefined1 auVar157 [16];
  undefined1 auVar150 [12];
  undefined1 auVar161 [16];
  undefined1 auVar151 [12];
  undefined1 auVar165 [16];
  undefined1 auVar152 [12];
  undefined1 auVar169 [16];
  float fVar210;
  float fVar214;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar153 [12];
  undefined1 auVar179 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  float fVar211;
  float fVar212;
  float fVar215;
  float fVar216;
  undefined8 uVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar202;
  undefined1 auVar203 [16];
  float fVar220;
  float fVar221;
  float fVar252;
  float fVar254;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [16];
  undefined1 auVar236 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar253;
  float fVar255;
  float fVar256;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar245;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  int iVar257;
  char cVar283;
  undefined1 uVar284;
  int iVar285;
  vfloat4 v;
  int iVar258;
  int iVar259;
  undefined1 auVar263 [16];
  char cVar286;
  undefined1 auVar267 [16];
  undefined1 auVar271 [16];
  undefined1 auVar275 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar295;
  float fVar299;
  undefined1 auVar290 [16];
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  float fVar305;
  float fVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar320;
  float fVar321;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  char cVar330;
  float fVar322;
  float fVar323;
  float fVar331;
  float fVar333;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  float fVar332;
  float fVar334;
  float fVar335;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar336;
  float fVar337;
  float fVar340;
  float fVar341;
  float fVar343;
  float fVar345;
  undefined1 auVar338 [16];
  float fVar342;
  float fVar344;
  float fVar346;
  undefined1 auVar339 [16];
  float fVar347;
  float fVar348;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  undefined1 auVar349 [16];
  float fVar356;
  float fVar357;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  float fVar366;
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  float fVar369;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  undefined1 auVar370 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar371;
  float fVar379;
  float fVar385;
  float fVar387;
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar382;
  float fVar386;
  float fVar388;
  undefined1 auVar383 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar384;
  float fVar389;
  float fVar399;
  float fVar400;
  float fVar401;
  undefined1 auVar390 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar391;
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar397;
  undefined1 auVar398 [16];
  float fVar402;
  float fVar403;
  float fVar409;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  float fVar414;
  float fVar415;
  float fVar419;
  float fVar420;
  float fVar421;
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  float fVar422;
  float fVar423;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  undefined4 local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  char local_4d8;
  char cStack_4d7;
  undefined1 uStack_4d6;
  undefined1 uStack_4d5;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  undefined2 local_448;
  undefined2 uStack_446;
  undefined2 uStack_444;
  undefined2 uStack_442;
  undefined4 local_428;
  undefined2 uStack_424;
  undefined2 uStack_422;
  undefined4 uStack_3fc;
  undefined8 local_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined1 local_3c8 [16];
  Precalculations *local_3b0;
  ulong local_3a8;
  RayQueryContext *local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 (*local_340) [16];
  RTCFilterFunctionNArguments args;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_4> bhit;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar134;
  undefined1 auVar148 [12];
  undefined1 auVar176 [16];
  undefined1 auVar180 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar158 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar177 [16];
  undefined1 auVar181 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar178 [16];
  undefined1 auVar182 [16];
  undefined2 uVar204;
  int iVar206;
  int iVar207;
  int iVar208;
  int iVar209;
  undefined1 auVar224 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar260 [12];
  undefined1 auVar261 [12];
  undefined1 auVar262 [12];
  undefined1 auVar268 [16];
  undefined1 auVar272 [16];
  undefined1 auVar276 [16];
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  
  PVar20 = prim[1];
  uVar126 = (ulong)(byte)PVar20;
  lVar129 = uVar126 * 0x25;
  uVar133 = *(undefined4 *)(prim + uVar126 * 4 + 6);
  uVar21 = *(undefined4 *)(prim + uVar126 * 5 + 6);
  uVar22 = *(undefined4 *)(prim + uVar126 * 6 + 6);
  uVar10 = *(undefined4 *)(prim + uVar126 * 0xf + 6);
  uVar23 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + 6);
  uVar24 = *(undefined4 *)(prim + uVar126 * 0x11 + 6);
  uVar11 = *(undefined4 *)(prim + uVar126 * 0x1a + 6);
  uVar12 = *(undefined4 *)(prim + uVar126 * 0x1b + 6);
  uVar25 = *(undefined4 *)(prim + uVar126 * 0x1c + 6);
  pPVar8 = prim + lVar129 + 6;
  fVar411 = *(float *)(pPVar8 + 0xc);
  fVar220 = (*(float *)(ray + k * 4) - *(float *)pPVar8) * fVar411;
  fVar252 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar8 + 4)) * fVar411;
  fVar254 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar8 + 8)) * fVar411;
  fVar402 = *(float *)(ray + k * 4 + 0x40) * fVar411;
  fVar409 = *(float *)(ray + k * 4 + 0x50) * fVar411;
  fVar411 = *(float *)(ray + k * 4 + 0x60) * fVar411;
  uVar284 = (undefined1)((uint)uVar21 >> 0x18);
  uVar204 = CONCAT11(uVar284,uVar284);
  uVar284 = (undefined1)((uint)uVar21 >> 0x10);
  uVar217 = CONCAT35(CONCAT21(uVar204,uVar284),CONCAT14(uVar284,uVar21));
  cVar283 = (char)((uint)uVar21 >> 8);
  uVar62 = CONCAT51(CONCAT41((int)((ulong)uVar217 >> 0x20),cVar283),cVar283);
  cVar213 = (char)uVar21;
  uVar134 = CONCAT62(uVar62,CONCAT11(cVar213,cVar213));
  auVar265._8_4_ = 0;
  auVar265._0_8_ = uVar134;
  auVar265._12_2_ = uVar204;
  auVar265._14_2_ = uVar204;
  uVar204 = (undefined2)((ulong)uVar217 >> 0x20);
  auVar264._12_4_ = auVar265._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar134;
  auVar264._10_2_ = uVar204;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263._8_2_ = uVar204;
  auVar263._0_8_ = uVar134;
  uVar204 = (undefined2)uVar62;
  auVar63._4_8_ = auVar263._8_8_;
  auVar63._2_2_ = uVar204;
  auVar63._0_2_ = uVar204;
  iVar257 = (int)CONCAT11(cVar213,cVar213) >> 8;
  iVar285 = auVar63._0_4_ >> 0x18;
  auVar260._0_8_ = CONCAT44(iVar285,iVar257);
  auVar260._8_4_ = auVar263._8_4_ >> 0x18;
  auVar266._12_4_ = auVar264._12_4_ >> 0x18;
  auVar266._0_12_ = auVar260;
  fVar385 = (float)iVar285;
  cVar286 = cVar283 >> 7;
  auVar29[0xd] = 0;
  auVar29._0_13_ = auVar266._0_13_;
  auVar29[0xe] = cVar286;
  auVar33[0xc] = cVar286;
  auVar33._0_12_ = auVar260;
  auVar33._13_2_ = auVar29._13_2_;
  auVar37[0xb] = 0;
  auVar37._0_11_ = auVar260._0_11_;
  auVar37._12_3_ = auVar33._12_3_;
  auVar41[10] = cVar286;
  auVar41._0_10_ = auVar260._0_10_;
  auVar41._11_4_ = auVar37._11_4_;
  auVar45[9] = 0;
  auVar45._0_9_ = auVar260._0_9_;
  auVar45._10_5_ = auVar41._10_5_;
  auVar49[8] = cVar283;
  auVar49._0_8_ = auVar260._0_8_;
  auVar49._9_6_ = auVar45._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar49._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar213 >> 7);
  auVar53._6_9_ = Var64;
  auVar53[5] = (char)((uint)uVar22 >> 0x10);
  auVar53[4] = (undefined1)((short)cVar213 >> 7);
  auVar53._0_4_ = iVar257;
  cVar286 = (char)((uint)uVar22 >> 8);
  auVar65._2_11_ = auVar53._4_11_;
  auVar65[1] = cVar286;
  auVar65[0] = (undefined1)((short)cVar213 >> 7);
  cVar283 = (char)uVar22;
  auVar57._2_13_ = auVar65;
  auVar57._0_2_ = CONCAT11(cVar283,cVar213);
  uVar204 = (undefined2)Var64;
  auVar269._0_12_ = auVar57._0_12_;
  auVar269._12_2_ = uVar204;
  auVar269._14_2_ = uVar204;
  auVar268._12_4_ = auVar269._12_4_;
  auVar268._0_10_ = auVar57._0_10_;
  auVar268._10_2_ = auVar53._4_2_;
  auVar267._10_6_ = auVar268._10_6_;
  auVar267._0_8_ = auVar57._0_8_;
  auVar267._8_2_ = auVar53._4_2_;
  auVar66._4_8_ = auVar267._8_8_;
  auVar66._2_2_ = auVar65._0_2_;
  auVar66._0_2_ = auVar65._0_2_;
  iVar258 = (int)CONCAT11(cVar283,cVar213) >> 8;
  iVar285 = auVar66._0_4_ >> 0x18;
  auVar261._0_8_ = CONCAT44(iVar285,iVar258);
  auVar261._8_4_ = auVar267._8_4_ >> 0x18;
  auVar270._12_4_ = auVar268._12_4_ >> 0x18;
  auVar270._0_12_ = auVar261;
  fVar425 = (float)iVar285;
  cVar213 = cVar286 >> 7;
  auVar30[0xd] = 0;
  auVar30._0_13_ = auVar270._0_13_;
  auVar30[0xe] = cVar213;
  auVar34[0xc] = cVar213;
  auVar34._0_12_ = auVar261;
  auVar34._13_2_ = auVar30._13_2_;
  auVar38[0xb] = 0;
  auVar38._0_11_ = auVar261._0_11_;
  auVar38._12_3_ = auVar34._12_3_;
  auVar42[10] = cVar213;
  auVar42._0_10_ = auVar261._0_10_;
  auVar42._11_4_ = auVar38._11_4_;
  auVar46[9] = 0;
  auVar46._0_9_ = auVar261._0_9_;
  auVar46._10_5_ = auVar42._10_5_;
  auVar50[8] = cVar286;
  auVar50._0_8_ = auVar261._0_8_;
  auVar50._9_6_ = auVar46._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar50._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar283 >> 7);
  auVar54._6_9_ = Var64;
  auVar54[5] = (char)((uint)uVar23 >> 0x10);
  auVar54[4] = (undefined1)((short)cVar283 >> 7);
  auVar54._0_4_ = iVar258;
  cVar330 = (char)((uint)uVar23 >> 8);
  auVar67._2_11_ = auVar54._4_11_;
  auVar67[1] = cVar330;
  auVar67[0] = (undefined1)((short)cVar283 >> 7);
  cVar286 = (char)uVar23;
  auVar58._2_13_ = auVar67;
  auVar58._0_2_ = CONCAT11(cVar286,cVar283);
  uVar204 = (undefined2)Var64;
  auVar273._0_12_ = auVar58._0_12_;
  auVar273._12_2_ = uVar204;
  auVar273._14_2_ = uVar204;
  auVar272._12_4_ = auVar273._12_4_;
  auVar272._0_10_ = auVar58._0_10_;
  auVar272._10_2_ = auVar54._4_2_;
  auVar271._10_6_ = auVar272._10_6_;
  auVar271._0_8_ = auVar58._0_8_;
  auVar271._8_2_ = auVar54._4_2_;
  auVar68._4_8_ = auVar271._8_8_;
  auVar68._2_2_ = auVar67._0_2_;
  auVar68._0_2_ = auVar67._0_2_;
  iVar259 = (int)CONCAT11(cVar286,cVar283) >> 8;
  iVar285 = auVar68._0_4_ >> 0x18;
  auVar262._0_8_ = CONCAT44(iVar285,iVar259);
  auVar262._8_4_ = auVar271._8_4_ >> 0x18;
  auVar274._12_4_ = auVar272._12_4_ >> 0x18;
  auVar274._0_12_ = auVar262;
  fVar372 = (float)iVar285;
  cVar213 = cVar330 >> 7;
  auVar31[0xd] = 0;
  auVar31._0_13_ = auVar274._0_13_;
  auVar31[0xe] = cVar213;
  auVar35[0xc] = cVar213;
  auVar35._0_12_ = auVar262;
  auVar35._13_2_ = auVar31._13_2_;
  auVar39[0xb] = 0;
  auVar39._0_11_ = auVar262._0_11_;
  auVar39._12_3_ = auVar35._12_3_;
  auVar43[10] = cVar213;
  auVar43._0_10_ = auVar262._0_10_;
  auVar43._11_4_ = auVar39._11_4_;
  auVar47[9] = 0;
  auVar47._0_9_ = auVar262._0_9_;
  auVar47._10_5_ = auVar43._10_5_;
  auVar51[8] = cVar330;
  auVar51._0_8_ = auVar262._0_8_;
  auVar51._9_6_ = auVar47._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar51._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar286 >> 7);
  auVar55._6_9_ = Var64;
  auVar55[5] = (char)((uint)uVar24 >> 0x10);
  auVar55[4] = (undefined1)((short)cVar286 >> 7);
  auVar55._0_4_ = iVar259;
  auVar69._2_11_ = auVar55._4_11_;
  auVar69[1] = (char)((uint)uVar24 >> 8);
  auVar69[0] = (undefined1)((short)cVar286 >> 7);
  sVar143 = CONCAT11((char)uVar24,cVar286);
  auVar59._2_13_ = auVar69;
  auVar59._0_2_ = sVar143;
  uVar204 = (undefined2)Var64;
  auVar277._0_12_ = auVar59._0_12_;
  auVar277._12_2_ = uVar204;
  auVar277._14_2_ = uVar204;
  auVar276._12_4_ = auVar277._12_4_;
  auVar276._0_10_ = auVar59._0_10_;
  auVar276._10_2_ = auVar55._4_2_;
  auVar275._10_6_ = auVar276._10_6_;
  auVar275._0_8_ = auVar59._0_8_;
  auVar275._8_2_ = auVar55._4_2_;
  auVar70._4_8_ = auVar275._8_8_;
  auVar70._2_2_ = auVar69._0_2_;
  auVar70._0_2_ = auVar69._0_2_;
  fVar305 = (float)((int)sVar143 >> 8);
  fVar317 = (float)(auVar70._0_4_ >> 0x18);
  fVar319 = (float)(auVar275._8_4_ >> 0x18);
  fVar144 = fVar411 * fVar305;
  fVar205 = fVar411 * fVar317;
  auVar148._0_8_ = CONCAT44(fVar205,fVar144);
  auVar148._8_4_ = fVar411 * fVar319;
  auVar174._12_4_ = fVar411 * (float)(auVar276._12_4_ >> 0x18);
  auVar174._0_12_ = auVar148;
  fVar414 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar129 + 0x16)) *
            *(float *)(prim + lVar129 + 0x1a);
  local_4d8 = (char)uVar133;
  cStack_4d7 = (char)((uint)uVar133 >> 8);
  uStack_4d6 = (undefined1)((uint)uVar133 >> 0x10);
  uStack_4d5 = (undefined1)((uint)uVar133 >> 0x18);
  auVar86[0xd] = 0;
  auVar86._0_13_ = auVar174._0_13_;
  auVar86[0xe] = (char)((uint)fVar205 >> 0x18);
  auVar91[0xc] = (char)((uint)fVar205 >> 0x10);
  auVar91._0_12_ = auVar148;
  auVar91._13_2_ = auVar86._13_2_;
  auVar96[0xb] = 0;
  auVar96._0_11_ = auVar148._0_11_;
  auVar96._12_3_ = auVar91._12_3_;
  auVar102[10] = (char)((uint)fVar205 >> 8);
  auVar102._0_10_ = auVar148._0_10_;
  auVar102._11_4_ = auVar96._11_4_;
  auVar106[9] = 0;
  auVar106._0_9_ = auVar148._0_9_;
  auVar106._10_5_ = auVar102._10_5_;
  auVar110[8] = SUB41(fVar205,0);
  auVar110._0_8_ = auVar148._0_8_;
  auVar110._9_6_ = auVar106._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar110._8_7_,uStack_4d5),(char)((uint)fVar144 >> 0x18));
  auVar114._6_9_ = Var64;
  auVar114[5] = uStack_4d6;
  auVar114[4] = (char)((uint)fVar144 >> 0x10);
  auVar114._0_4_ = fVar144;
  auVar118._2_11_ = auVar114._4_11_;
  auVar118[1] = cStack_4d7;
  auVar118[0] = (char)((uint)fVar144 >> 8);
  sVar143 = CONCAT11(local_4d8,SUB41(fVar144,0));
  auVar122._2_13_ = auVar118;
  auVar122._0_2_ = sVar143;
  uVar204 = (undefined2)Var64;
  auVar155._0_12_ = auVar122._0_12_;
  auVar155._12_2_ = uVar204;
  auVar155._14_2_ = uVar204;
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._0_10_ = auVar122._0_10_;
  auVar154._10_2_ = auVar114._4_2_;
  auVar222._10_6_ = auVar154._10_6_;
  auVar222._0_8_ = auVar122._0_8_;
  auVar222._8_2_ = auVar114._4_2_;
  auVar71._4_8_ = auVar222._8_8_;
  auVar71._2_2_ = auVar118._0_2_;
  auVar71._0_2_ = auVar118._0_2_;
  iVar285 = (int)sVar143 >> 8;
  iVar206 = auVar71._0_4_ >> 0x18;
  auVar149._0_8_ = CONCAT44(iVar206,iVar285);
  auVar149._8_4_ = auVar222._8_4_ >> 0x18;
  auVar156._12_4_ = auVar154._12_4_ >> 0x18;
  auVar156._0_12_ = auVar149;
  fVar350 = (float)iVar206;
  local_448._0_1_ = (char)uVar10;
  local_448._1_1_ = (char)((uint)uVar10 >> 8);
  uStack_446._0_1_ = (undefined1)((uint)uVar10 >> 0x10);
  uStack_446._1_1_ = (undefined1)((uint)uVar10 >> 0x18);
  cVar213 = cStack_4d7 >> 7;
  auVar87[0xd] = 0;
  auVar87._0_13_ = auVar156._0_13_;
  auVar87[0xe] = cVar213;
  auVar92[0xc] = cVar213;
  auVar92._0_12_ = auVar149;
  auVar92._13_2_ = auVar87._13_2_;
  auVar97[0xb] = 0;
  auVar97._0_11_ = auVar149._0_11_;
  auVar97._12_3_ = auVar92._12_3_;
  auVar103[10] = cVar213;
  auVar103._0_10_ = auVar149._0_10_;
  auVar103._11_4_ = auVar97._11_4_;
  auVar107[9] = 0;
  auVar107._0_9_ = auVar149._0_9_;
  auVar107._10_5_ = auVar103._10_5_;
  auVar111[8] = cStack_4d7;
  auVar111._0_8_ = auVar149._0_8_;
  auVar111._9_6_ = auVar107._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar111._8_7_,uStack_446._1_1_),(short)local_4d8 >> 7);
  auVar115._6_9_ = Var64;
  auVar115[5] = (undefined1)uStack_446;
  auVar115[4] = (undefined1)((short)local_4d8 >> 7);
  auVar115._0_4_ = iVar285;
  auVar119._2_11_ = auVar115._4_11_;
  auVar119[1] = local_448._1_1_;
  auVar119[0] = (undefined1)((short)local_4d8 >> 7);
  auVar123._2_13_ = auVar119;
  auVar123._0_2_ = CONCAT11((char)local_448,local_4d8);
  uVar204 = (undefined2)Var64;
  auVar159._0_12_ = auVar123._0_12_;
  auVar159._12_2_ = uVar204;
  auVar159._14_2_ = uVar204;
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._0_10_ = auVar123._0_10_;
  auVar158._10_2_ = auVar115._4_2_;
  auVar157._10_6_ = auVar158._10_6_;
  auVar157._0_8_ = auVar123._0_8_;
  auVar157._8_2_ = auVar115._4_2_;
  auVar72._4_8_ = auVar157._8_8_;
  auVar72._2_2_ = auVar119._0_2_;
  auVar72._0_2_ = auVar119._0_2_;
  iVar206 = (int)CONCAT11((char)local_448,local_4d8) >> 8;
  iVar207 = auVar72._0_4_ >> 0x18;
  auVar150._0_8_ = CONCAT44(iVar207,iVar206);
  auVar150._8_4_ = auVar157._8_4_ >> 0x18;
  auVar160._12_4_ = auVar158._12_4_ >> 0x18;
  auVar160._0_12_ = auVar150;
  fVar340 = (float)iVar207;
  local_428._0_1_ = (char)uVar11;
  local_428._1_1_ = (char)((uint)uVar11 >> 8);
  local_428._2_1_ = (undefined1)((uint)uVar11 >> 0x10);
  local_428._3_1_ = (undefined1)((uint)uVar11 >> 0x18);
  cVar213 = local_448._1_1_ >> 7;
  auVar88[0xd] = 0;
  auVar88._0_13_ = auVar160._0_13_;
  auVar88[0xe] = cVar213;
  auVar93[0xc] = cVar213;
  auVar93._0_12_ = auVar150;
  auVar93._13_2_ = auVar88._13_2_;
  auVar98[0xb] = 0;
  auVar98._0_11_ = auVar150._0_11_;
  auVar98._12_3_ = auVar93._12_3_;
  auVar104[10] = cVar213;
  auVar104._0_10_ = auVar150._0_10_;
  auVar104._11_4_ = auVar98._11_4_;
  auVar108[9] = 0;
  auVar108._0_9_ = auVar150._0_9_;
  auVar108._10_5_ = auVar104._10_5_;
  auVar112[8] = local_448._1_1_;
  auVar112._0_8_ = auVar150._0_8_;
  auVar112._9_6_ = auVar108._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar112._8_7_,local_428._3_1_),(short)(char)local_448 >> 7);
  auVar116._6_9_ = Var64;
  auVar116[5] = local_428._2_1_;
  auVar116[4] = (undefined1)((short)(char)local_448 >> 7);
  auVar116._0_4_ = iVar206;
  auVar120._2_11_ = auVar116._4_11_;
  auVar120[1] = local_428._1_1_;
  auVar120[0] = (undefined1)((short)(char)local_448 >> 7);
  auVar124._2_13_ = auVar120;
  auVar124._0_2_ = CONCAT11((char)local_428,(char)local_448);
  uVar204 = (undefined2)Var64;
  auVar163._0_12_ = auVar124._0_12_;
  auVar163._12_2_ = uVar204;
  auVar163._14_2_ = uVar204;
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._0_10_ = auVar124._0_10_;
  auVar162._10_2_ = auVar116._4_2_;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._0_8_ = auVar124._0_8_;
  auVar161._8_2_ = auVar116._4_2_;
  auVar73._4_8_ = auVar161._8_8_;
  auVar73._2_2_ = auVar120._0_2_;
  auVar73._0_2_ = auVar120._0_2_;
  iVar207 = (int)CONCAT11((char)local_428,(char)local_448) >> 8;
  iVar208 = auVar73._0_4_ >> 0x18;
  auVar151._0_8_ = CONCAT44(iVar208,iVar207);
  auVar151._8_4_ = auVar161._8_4_ >> 0x18;
  auVar164._12_4_ = auVar162._12_4_ >> 0x18;
  auVar164._0_12_ = auVar151;
  fVar318 = (float)iVar208;
  local_4f8._0_1_ = (char)uVar12;
  local_4f8._1_1_ = (char)((uint)uVar12 >> 8);
  local_4f8._2_1_ = (undefined1)((uint)uVar12 >> 0x10);
  local_4f8._3_1_ = (undefined1)((uint)uVar12 >> 0x18);
  cVar213 = local_428._1_1_ >> 7;
  auVar89[0xd] = 0;
  auVar89._0_13_ = auVar164._0_13_;
  auVar89[0xe] = cVar213;
  auVar94[0xc] = cVar213;
  auVar94._0_12_ = auVar151;
  auVar94._13_2_ = auVar89._13_2_;
  auVar99[0xb] = 0;
  auVar99._0_11_ = auVar151._0_11_;
  auVar99._12_3_ = auVar94._12_3_;
  auVar105[10] = cVar213;
  auVar105._0_10_ = auVar151._0_10_;
  auVar105._11_4_ = auVar99._11_4_;
  auVar109[9] = 0;
  auVar109._0_9_ = auVar151._0_9_;
  auVar109._10_5_ = auVar105._10_5_;
  auVar113[8] = local_428._1_1_;
  auVar113._0_8_ = auVar151._0_8_;
  auVar113._9_6_ = auVar109._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar113._8_7_,local_4f8._3_1_),(short)(char)local_428 >> 7);
  auVar117._6_9_ = Var64;
  auVar117[5] = local_4f8._2_1_;
  auVar117[4] = (undefined1)((short)(char)local_428 >> 7);
  auVar117._0_4_ = iVar207;
  auVar121._2_11_ = auVar117._4_11_;
  auVar121[1] = local_4f8._1_1_;
  auVar121[0] = (undefined1)((short)(char)local_428 >> 7);
  auVar125._2_13_ = auVar121;
  auVar125._0_2_ = CONCAT11((char)local_4f8,(char)local_428);
  uVar204 = (undefined2)Var64;
  auVar167._0_12_ = auVar125._0_12_;
  auVar167._12_2_ = uVar204;
  auVar167._14_2_ = uVar204;
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._0_10_ = auVar125._0_10_;
  auVar166._10_2_ = auVar117._4_2_;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._0_8_ = auVar125._0_8_;
  auVar165._8_2_ = auVar117._4_2_;
  auVar74._4_8_ = auVar165._8_8_;
  auVar74._2_2_ = auVar121._0_2_;
  auVar74._0_2_ = auVar121._0_2_;
  iVar208 = (int)CONCAT11((char)local_4f8,(char)local_428) >> 8;
  iVar209 = auVar74._0_4_ >> 0x18;
  auVar152._0_8_ = CONCAT44(iVar209,iVar208);
  auVar152._8_4_ = auVar165._8_4_ >> 0x18;
  auVar168._12_4_ = auVar166._12_4_ >> 0x18;
  auVar168._0_12_ = auVar152;
  fVar295 = (float)iVar209;
  cVar213 = local_4f8._1_1_ >> 7;
  auVar32[0xd] = 0;
  auVar32._0_13_ = auVar168._0_13_;
  auVar32[0xe] = cVar213;
  auVar36[0xc] = cVar213;
  auVar36._0_12_ = auVar152;
  auVar36._13_2_ = auVar32._13_2_;
  auVar40[0xb] = 0;
  auVar40._0_11_ = auVar152._0_11_;
  auVar40._12_3_ = auVar36._12_3_;
  auVar44[10] = cVar213;
  auVar44._0_10_ = auVar152._0_10_;
  auVar44._11_4_ = auVar40._11_4_;
  auVar48[9] = 0;
  auVar48._0_9_ = auVar152._0_9_;
  auVar48._10_5_ = auVar44._10_5_;
  auVar52[8] = local_4f8._1_1_;
  auVar52._0_8_ = auVar152._0_8_;
  auVar52._9_6_ = auVar48._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar52._8_7_,(char)((uint)uVar25 >> 0x18)),(short)(char)local_4f8 >> 7)
  ;
  auVar56._6_9_ = Var64;
  auVar56[5] = (char)((uint)uVar25 >> 0x10);
  auVar56[4] = (undefined1)((short)(char)local_4f8 >> 7);
  auVar56._0_4_ = iVar208;
  auVar75._2_11_ = auVar56._4_11_;
  auVar75[1] = (char)((uint)uVar25 >> 8);
  auVar75[0] = (undefined1)((short)(char)local_4f8 >> 7);
  sVar143 = CONCAT11((char)uVar25,(char)local_4f8);
  auVar60._2_13_ = auVar75;
  auVar60._0_2_ = sVar143;
  uVar204 = (undefined2)Var64;
  auVar171._0_12_ = auVar60._0_12_;
  auVar171._12_2_ = uVar204;
  auVar171._14_2_ = uVar204;
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._0_10_ = auVar60._0_10_;
  auVar170._10_2_ = auVar56._4_2_;
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._0_8_ = auVar60._0_8_;
  auVar169._8_2_ = auVar56._4_2_;
  auVar76._4_8_ = auVar169._8_8_;
  auVar76._2_2_ = auVar75._0_2_;
  auVar76._0_2_ = auVar75._0_2_;
  fVar145 = (float)((int)sVar143 >> 8);
  fVar210 = (float)(auVar76._0_4_ >> 0x18);
  fVar214 = (float)(auVar169._8_4_ >> 0x18);
  fVar403 = fVar402 * (float)iVar285 + fVar409 * (float)iVar257 + fVar411 * (float)iVar258;
  fVar410 = fVar402 * fVar350 + fVar409 * fVar385 + fVar411 * fVar425;
  fVar412 = fVar402 * (float)auVar149._8_4_ +
            fVar409 * (float)auVar260._8_4_ + fVar411 * (float)auVar261._8_4_;
  fVar413 = fVar402 * (float)auVar156._12_4_ +
            fVar409 * (float)auVar266._12_4_ + fVar411 * (float)auVar270._12_4_;
  fVar389 = fVar402 * (float)iVar206 + fVar409 * (float)iVar259 + fVar144;
  fVar399 = fVar402 * fVar340 + fVar409 * fVar372 + fVar205;
  fVar400 = fVar402 * (float)auVar150._8_4_ + fVar409 * (float)auVar262._8_4_ + auVar148._8_4_;
  fVar401 = fVar402 * (float)auVar160._12_4_ + fVar409 * (float)auVar274._12_4_ + auVar174._12_4_;
  fVar322 = fVar402 * (float)iVar207 + fVar409 * (float)iVar208 + fVar411 * fVar145;
  fVar331 = fVar402 * fVar318 + fVar409 * fVar295 + fVar411 * fVar210;
  fVar333 = fVar402 * (float)auVar151._8_4_ + fVar409 * (float)auVar152._8_4_ + fVar411 * fVar214;
  fVar402 = fVar402 * (float)auVar164._12_4_ +
            fVar409 * (float)auVar168._12_4_ + fVar411 * (float)(auVar170._12_4_ >> 0x18);
  uVar217 = *(undefined8 *)(prim + uVar126 * 7 + 6);
  uVar13 = *(undefined8 *)(prim + uVar126 * 0xb + 6);
  uVar14 = *(undefined8 *)(prim + uVar126 * 9 + 6);
  fVar347 = (float)iVar285 * fVar220 + (float)iVar257 * fVar252 + (float)iVar258 * fVar254;
  fVar425 = fVar350 * fVar220 + fVar385 * fVar252 + fVar425 * fVar254;
  fVar352 = (float)auVar149._8_4_ * fVar220 +
            (float)auVar260._8_4_ * fVar252 + (float)auVar261._8_4_ * fVar254;
  fVar354 = (float)auVar156._12_4_ * fVar220 +
            (float)auVar266._12_4_ * fVar252 + (float)auVar270._12_4_ * fVar254;
  fVar356 = (float)iVar206 * fVar220 + (float)iVar259 * fVar252 + fVar305 * fVar254;
  fVar361 = fVar340 * fVar220 + fVar372 * fVar252 + fVar317 * fVar254;
  fVar363 = (float)auVar150._8_4_ * fVar220 + (float)auVar262._8_4_ * fVar252 + fVar319 * fVar254;
  fVar365 = (float)auVar160._12_4_ * fVar220 +
            (float)auVar274._12_4_ * fVar252 + (float)(auVar276._12_4_ >> 0x18) * fVar254;
  fVar350 = fVar220 * (float)iVar207 + fVar252 * (float)iVar208 + fVar254 * fVar145;
  fVar372 = fVar220 * fVar318 + fVar252 * fVar295 + fVar254 * fVar210;
  fVar385 = fVar220 * (float)auVar151._8_4_ + fVar252 * (float)auVar152._8_4_ + fVar254 * fVar214;
  fVar409 = fVar220 * (float)auVar164._12_4_ +
            fVar252 * (float)auVar168._12_4_ + fVar254 * (float)(auVar170._12_4_ >> 0x18);
  fVar411 = (float)DAT_01f4bd50;
  fVar144 = DAT_01f4bd50._4_4_;
  fVar145 = DAT_01f4bd50._8_4_;
  fVar205 = DAT_01f4bd50._12_4_;
  uVar138 = -(uint)(fVar411 <= ABS(fVar403));
  uVar139 = -(uint)(fVar144 <= ABS(fVar410));
  uVar140 = -(uint)(fVar145 <= ABS(fVar412));
  uVar141 = -(uint)(fVar205 <= ABS(fVar413));
  auVar404._0_4_ = (uint)fVar403 & uVar138;
  auVar404._4_4_ = (uint)fVar410 & uVar139;
  auVar404._8_4_ = (uint)fVar412 & uVar140;
  auVar404._12_4_ = (uint)fVar413 & uVar141;
  auVar172._0_4_ = ~uVar138 & (uint)fVar411;
  auVar172._4_4_ = ~uVar139 & (uint)fVar144;
  auVar172._8_4_ = ~uVar140 & (uint)fVar145;
  auVar172._12_4_ = ~uVar141 & (uint)fVar205;
  auVar172 = auVar172 | auVar404;
  uVar138 = -(uint)(fVar411 <= ABS(fVar389));
  uVar139 = -(uint)(fVar144 <= ABS(fVar399));
  uVar140 = -(uint)(fVar145 <= ABS(fVar400));
  uVar141 = -(uint)(fVar205 <= ABS(fVar401));
  auVar390._0_4_ = (uint)fVar389 & uVar138;
  auVar390._4_4_ = (uint)fVar399 & uVar139;
  auVar390._8_4_ = (uint)fVar400 & uVar140;
  auVar390._12_4_ = (uint)fVar401 & uVar141;
  auVar306._0_4_ = ~uVar138 & (uint)fVar411;
  auVar306._4_4_ = ~uVar139 & (uint)fVar144;
  auVar306._8_4_ = ~uVar140 & (uint)fVar145;
  auVar306._12_4_ = ~uVar141 & (uint)fVar205;
  auVar306 = auVar306 | auVar390;
  uVar138 = -(uint)(fVar411 <= ABS(fVar322));
  uVar139 = -(uint)(fVar144 <= ABS(fVar331));
  uVar140 = -(uint)(fVar145 <= ABS(fVar333));
  uVar141 = -(uint)(fVar205 <= ABS(fVar402));
  auVar324._0_4_ = (uint)fVar322 & uVar138;
  auVar324._4_4_ = (uint)fVar331 & uVar139;
  auVar324._8_4_ = (uint)fVar333 & uVar140;
  auVar324._12_4_ = (uint)fVar402 & uVar141;
  auVar380._0_4_ = ~uVar138 & (uint)fVar411;
  auVar380._4_4_ = ~uVar139 & (uint)fVar144;
  auVar380._8_4_ = ~uVar140 & (uint)fVar145;
  auVar380._12_4_ = ~uVar141 & (uint)fVar205;
  auVar380 = auVar380 | auVar324;
  auVar222 = rcpps(_DAT_01f4bd50,auVar172);
  auVar223._0_4_ = auVar222._0_4_;
  auVar173._0_4_ = auVar172._0_4_ * auVar223._0_4_;
  fVar333 = auVar222._4_4_;
  auVar173._4_4_ = auVar172._4_4_ * fVar333;
  fVar402 = auVar222._8_4_;
  auVar173._8_4_ = auVar172._8_4_ * fVar402;
  fVar340 = auVar222._12_4_;
  auVar173._12_4_ = auVar172._12_4_ * fVar340;
  fVar389 = (1.0 - auVar173._0_4_) * auVar223._0_4_ + auVar223._0_4_;
  fVar333 = (1.0 - auVar173._4_4_) * fVar333 + fVar333;
  fVar402 = (1.0 - auVar173._8_4_) * fVar402 + fVar402;
  fVar340 = (1.0 - auVar173._12_4_) * fVar340 + fVar340;
  auVar174 = rcpps(auVar173,auVar306);
  fVar411 = auVar174._0_4_;
  fVar144 = auVar174._4_4_;
  fVar254 = auVar174._8_4_;
  fVar322 = auVar174._12_4_;
  fVar411 = (1.0 - auVar306._0_4_ * fVar411) * fVar411 + fVar411;
  fVar144 = (1.0 - auVar306._4_4_ * fVar144) * fVar144 + fVar144;
  fVar254 = (1.0 - auVar306._8_4_ * fVar254) * fVar254 + fVar254;
  fVar322 = (1.0 - auVar306._12_4_ * fVar322) * fVar322 + fVar322;
  auVar174 = rcpps(auVar174,auVar380);
  auVar175._0_4_ = auVar174._0_4_;
  fVar145 = auVar174._4_4_;
  fVar295 = auVar174._8_4_;
  fVar331 = auVar174._12_4_;
  fVar399 = (1.0 - auVar380._0_4_ * auVar175._0_4_) * auVar175._0_4_ + auVar175._0_4_;
  fVar145 = (1.0 - auVar380._4_4_ * fVar145) * fVar145 + fVar145;
  fVar295 = (1.0 - auVar380._8_4_ * fVar295) * fVar295 + fVar295;
  fVar331 = (1.0 - auVar380._12_4_ * fVar331) * fVar331 + fVar331;
  local_448 = (short)uVar217;
  uStack_446 = (undefined2)((ulong)uVar217 >> 0x10);
  uStack_444 = (undefined2)((ulong)uVar217 >> 0x20);
  uStack_442 = (undefined2)((ulong)uVar217 >> 0x30);
  auVar178._0_12_ = auVar174._0_12_;
  auVar178._12_2_ = auVar174._6_2_;
  auVar178._14_2_ = uStack_442;
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._0_10_ = auVar174._0_10_;
  auVar177._10_2_ = uStack_444;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._0_8_ = auVar174._0_8_;
  auVar176._8_2_ = auVar174._4_2_;
  auVar175._8_8_ = auVar176._8_8_;
  auVar175._6_2_ = uStack_446;
  auVar175._4_2_ = auVar174._2_2_;
  auVar179._0_4_ = (float)(int)local_448;
  fVar205 = (float)(auVar175._4_4_ >> 0x10);
  auVar153._0_8_ = CONCAT44(fVar205,auVar179._0_4_);
  auVar153._8_4_ = (float)(auVar176._8_4_ >> 0x10);
  local_428._0_2_ = (short)uVar13;
  local_428._2_2_ = (undefined2)((ulong)uVar13 >> 0x10);
  uStack_424 = (undefined2)((ulong)uVar13 >> 0x20);
  uStack_422 = (undefined2)((ulong)uVar13 >> 0x30);
  auVar226._0_12_ = auVar222._0_12_;
  auVar226._12_2_ = auVar222._6_2_;
  auVar226._14_2_ = uStack_422;
  auVar225._12_4_ = auVar226._12_4_;
  auVar225._0_10_ = auVar222._0_10_;
  auVar225._10_2_ = uStack_424;
  auVar224._10_6_ = auVar225._10_6_;
  auVar224._0_8_ = auVar222._0_8_;
  auVar224._8_2_ = auVar222._4_2_;
  auVar223._8_8_ = auVar224._8_8_;
  auVar223._6_2_ = local_428._2_2_;
  auVar223._4_2_ = auVar222._2_2_;
  auVar182._12_2_ = (short)((uint)fVar205 >> 0x10);
  auVar182._0_12_ = auVar153;
  auVar182._14_2_ = (short)((ulong)uVar14 >> 0x30);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._0_10_ = auVar153._0_10_;
  auVar181._10_2_ = (short)((ulong)uVar14 >> 0x20);
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = SUB42(fVar205,0);
  auVar180._0_8_ = auVar153._0_8_;
  auVar179._8_8_ = auVar180._8_8_;
  auVar179._6_2_ = (short)((ulong)uVar14 >> 0x10);
  auVar179._4_2_ = (short)((uint)auVar179._0_4_ >> 0x10);
  fVar210 = (float)(auVar179._4_4_ >> 0x10);
  fVar305 = (float)(auVar180._8_4_ >> 0x10);
  uVar134 = *(ulong *)(prim + uVar126 * 0xd + 6);
  uVar204 = (undefined2)(uVar134 >> 0x30);
  auVar229._8_4_ = 0;
  auVar229._0_8_ = uVar134;
  auVar229._12_2_ = uVar204;
  auVar229._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar134 >> 0x20);
  auVar228._12_4_ = auVar229._12_4_;
  auVar228._8_2_ = 0;
  auVar228._0_8_ = uVar134;
  auVar228._10_2_ = uVar204;
  auVar227._10_6_ = auVar228._10_6_;
  auVar227._8_2_ = uVar204;
  auVar227._0_8_ = uVar134;
  uVar204 = (undefined2)(uVar134 >> 0x10);
  auVar77._4_8_ = auVar227._8_8_;
  auVar77._2_2_ = uVar204;
  auVar77._0_2_ = uVar204;
  uVar135 = *(ulong *)(prim + uVar126 * 0x12 + 6);
  uVar204 = (undefined2)(uVar135 >> 0x30);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar135;
  auVar185._12_2_ = uVar204;
  auVar185._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar135 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar135;
  auVar184._10_2_ = uVar204;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar204;
  auVar183._0_8_ = uVar135;
  uVar204 = (undefined2)(uVar135 >> 0x10);
  auVar78._4_8_ = auVar183._8_8_;
  auVar78._2_2_ = uVar204;
  auVar78._0_2_ = uVar204;
  fVar214 = (float)(auVar78._0_4_ >> 0x10);
  fVar317 = (float)(auVar183._8_4_ >> 0x10);
  uVar131 = *(ulong *)(prim + uVar126 * 0x16 + 6);
  uVar204 = (undefined2)(uVar131 >> 0x30);
  auVar232._8_4_ = 0;
  auVar232._0_8_ = uVar131;
  auVar232._12_2_ = uVar204;
  auVar232._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar131 >> 0x20);
  auVar231._12_4_ = auVar232._12_4_;
  auVar231._8_2_ = 0;
  auVar231._0_8_ = uVar131;
  auVar231._10_2_ = uVar204;
  auVar230._10_6_ = auVar231._10_6_;
  auVar230._8_2_ = uVar204;
  auVar230._0_8_ = uVar131;
  uVar204 = (undefined2)(uVar131 >> 0x10);
  auVar79._4_8_ = auVar230._8_8_;
  auVar79._2_2_ = uVar204;
  auVar79._0_2_ = uVar204;
  uVar15 = *(ulong *)(prim + uVar126 * 0x14 + 6);
  uVar204 = (undefined2)(uVar15 >> 0x30);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar15;
  auVar188._12_2_ = uVar204;
  auVar188._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar15 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar15;
  auVar187._10_2_ = uVar204;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar204;
  auVar186._0_8_ = uVar15;
  uVar204 = (undefined2)(uVar15 >> 0x10);
  auVar80._4_8_ = auVar186._8_8_;
  auVar80._2_2_ = uVar204;
  auVar80._0_2_ = uVar204;
  fVar220 = (float)(auVar80._0_4_ >> 0x10);
  fVar318 = (float)(auVar186._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar126 * 0x18 + 6);
  uVar204 = (undefined2)(uVar16 >> 0x30);
  auVar235._8_4_ = 0;
  auVar235._0_8_ = uVar16;
  auVar235._12_2_ = uVar204;
  auVar235._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar16 >> 0x20);
  auVar234._12_4_ = auVar235._12_4_;
  auVar234._8_2_ = 0;
  auVar234._0_8_ = uVar16;
  auVar234._10_2_ = uVar204;
  auVar233._10_6_ = auVar234._10_6_;
  auVar233._8_2_ = uVar204;
  auVar233._0_8_ = uVar16;
  uVar204 = (undefined2)(uVar16 >> 0x10);
  auVar81._4_8_ = auVar233._8_8_;
  auVar81._2_2_ = uVar204;
  auVar81._0_2_ = uVar204;
  uVar17 = *(ulong *)(prim + uVar126 * 0x1d + 6);
  uVar204 = (undefined2)(uVar17 >> 0x30);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar17;
  auVar191._12_2_ = uVar204;
  auVar191._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar17 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar17;
  auVar190._10_2_ = uVar204;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar204;
  auVar189._0_8_ = uVar17;
  uVar204 = (undefined2)(uVar17 >> 0x10);
  auVar82._4_8_ = auVar189._8_8_;
  auVar82._2_2_ = uVar204;
  auVar82._0_2_ = uVar204;
  fVar252 = (float)(auVar82._0_4_ >> 0x10);
  fVar319 = (float)(auVar189._8_4_ >> 0x10);
  uVar18 = *(ulong *)(prim + uVar126 * 0x21 + 6);
  uVar204 = (undefined2)(uVar18 >> 0x30);
  auVar238._8_4_ = 0;
  auVar238._0_8_ = uVar18;
  auVar238._12_2_ = uVar204;
  auVar238._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar18 >> 0x20);
  auVar237._12_4_ = auVar238._12_4_;
  auVar237._8_2_ = 0;
  auVar237._0_8_ = uVar18;
  auVar237._10_2_ = uVar204;
  auVar236._10_6_ = auVar237._10_6_;
  auVar236._8_2_ = uVar204;
  auVar236._0_8_ = uVar18;
  uVar204 = (undefined2)(uVar18 >> 0x10);
  auVar83._4_8_ = auVar236._8_8_;
  auVar83._2_2_ = uVar204;
  auVar83._0_2_ = uVar204;
  uVar19 = *(ulong *)(prim + uVar126 * 0x1f + 6);
  uVar204 = (undefined2)(uVar19 >> 0x30);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar19;
  auVar194._12_2_ = uVar204;
  auVar194._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar19 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar19;
  auVar193._10_2_ = uVar204;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar204;
  auVar192._0_8_ = uVar19;
  uVar204 = (undefined2)(uVar19 >> 0x10);
  auVar84._4_8_ = auVar192._8_8_;
  auVar84._2_2_ = uVar204;
  auVar84._0_2_ = uVar204;
  fVar400 = (float)(auVar84._0_4_ >> 0x10);
  fVar401 = (float)(auVar192._8_4_ >> 0x10);
  uVar126 = *(ulong *)(prim + uVar126 * 0x23 + 6);
  uVar204 = (undefined2)(uVar126 >> 0x30);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar126;
  auVar197._12_2_ = uVar204;
  auVar197._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar126 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar126;
  auVar196._10_2_ = uVar204;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar204;
  auVar195._0_8_ = uVar126;
  uVar204 = (undefined2)(uVar126 >> 0x10);
  auVar85._4_8_ = auVar195._8_8_;
  auVar85._2_2_ = uVar204;
  auVar85._0_2_ = uVar204;
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar307._0_8_ =
       CONCAT44(((((float)(auVar223._4_4_ >> 0x10) - fVar205) * fVar414 + fVar205) - fVar425) *
                fVar333,((((float)(int)(short)local_428 - auVar179._0_4_) * fVar414 + auVar179._0_4_
                         ) - fVar347) * fVar389);
  auVar307._8_4_ =
       ((((float)(auVar224._8_4_ >> 0x10) - auVar153._8_4_) * fVar414 + auVar153._8_4_) - fVar352) *
       fVar402;
  auVar307._12_4_ =
       ((((float)(auVar225._12_4_ >> 0x10) - (float)(auVar177._12_4_ >> 0x10)) * fVar414 +
        (float)(auVar177._12_4_ >> 0x10)) - fVar354) * fVar340;
  auVar358._0_4_ =
       ((((float)(int)(short)uVar134 - (float)(int)(short)uVar14) * fVar414 +
        (float)(int)(short)uVar14) - fVar347) * fVar389;
  auVar358._4_4_ =
       ((((float)(auVar77._0_4_ >> 0x10) - fVar210) * fVar414 + fVar210) - fVar425) * fVar333;
  auVar358._8_4_ =
       ((((float)(auVar227._8_4_ >> 0x10) - fVar305) * fVar414 + fVar305) - fVar352) * fVar402;
  auVar358._12_4_ =
       ((((float)(auVar228._12_4_ >> 0x10) - (float)(auVar181._12_4_ >> 0x10)) * fVar414 +
        (float)(auVar181._12_4_ >> 0x10)) - fVar354) * fVar340;
  auVar367._0_8_ =
       CONCAT44(((((float)(auVar79._0_4_ >> 0x10) - fVar214) * fVar414 + fVar214) - fVar361) *
                fVar144,((((float)(int)(short)uVar131 - (float)(int)(short)uVar135) * fVar414 +
                         (float)(int)(short)uVar135) - fVar356) * fVar411);
  auVar367._8_4_ =
       ((((float)(auVar230._8_4_ >> 0x10) - fVar317) * fVar414 + fVar317) - fVar363) * fVar254;
  auVar367._12_4_ =
       ((((float)(auVar231._12_4_ >> 0x10) - (float)(auVar184._12_4_ >> 0x10)) * fVar414 +
        (float)(auVar184._12_4_ >> 0x10)) - fVar365) * fVar322;
  aVar371._0_4_ =
       ((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar414 +
        (float)(int)(short)uVar15) - fVar356) * fVar411;
  aVar371._4_4_ =
       ((((float)(auVar81._0_4_ >> 0x10) - fVar220) * fVar414 + fVar220) - fVar361) * fVar144;
  aVar371._8_4_ =
       ((((float)(auVar233._8_4_ >> 0x10) - fVar318) * fVar414 + fVar318) - fVar363) * fVar254;
  aVar371._12_4_ =
       ((((float)(auVar234._12_4_ >> 0x10) - (float)(auVar187._12_4_ >> 0x10)) * fVar414 +
        (float)(auVar187._12_4_ >> 0x10)) - fVar365) * fVar322;
  auVar381._0_8_ =
       CONCAT44(((((float)(auVar83._0_4_ >> 0x10) - fVar252) * fVar414 + fVar252) - fVar372) *
                fVar145,((((float)(int)(short)uVar18 - (float)(int)(short)uVar17) * fVar414 +
                         (float)(int)(short)uVar17) - fVar350) * fVar399);
  auVar381._8_4_ =
       ((((float)(auVar236._8_4_ >> 0x10) - fVar319) * fVar414 + fVar319) - fVar385) * fVar295;
  auVar381._12_4_ =
       ((((float)(auVar237._12_4_ >> 0x10) - (float)(auVar190._12_4_ >> 0x10)) * fVar414 +
        (float)(auVar190._12_4_ >> 0x10)) - fVar409) * fVar331;
  aVar391._0_4_ =
       ((((float)(int)(short)uVar126 - (float)(int)(short)uVar19) * fVar414 +
        (float)(int)(short)uVar19) - fVar350) * fVar399;
  aVar391._4_4_ =
       ((((float)(auVar85._0_4_ >> 0x10) - fVar400) * fVar414 + fVar400) - fVar372) * fVar145;
  aVar391._8_4_ =
       ((((float)(auVar195._8_4_ >> 0x10) - fVar401) * fVar414 + fVar401) - fVar385) * fVar295;
  aVar391._12_4_ =
       ((((float)(auVar196._12_4_ >> 0x10) - (float)(auVar193._12_4_ >> 0x10)) * fVar414 +
        (float)(auVar193._12_4_ >> 0x10)) - fVar409) * fVar331;
  auVar290._8_4_ = auVar307._8_4_;
  auVar290._0_8_ = auVar307._0_8_;
  auVar290._12_4_ = auVar307._12_4_;
  auVar222 = minps(auVar290,auVar358);
  auVar278._8_4_ = auVar367._8_4_;
  auVar278._0_8_ = auVar367._0_8_;
  auVar278._12_4_ = auVar367._12_4_;
  auVar174 = minps(auVar278,(undefined1  [16])aVar371);
  auVar222 = maxps(auVar222,auVar174);
  auVar279._8_4_ = auVar381._8_4_;
  auVar279._0_8_ = auVar381._0_8_;
  auVar279._12_4_ = auVar381._12_4_;
  auVar174 = minps(auVar279,(undefined1  [16])aVar391);
  auVar239._4_4_ = uVar133;
  auVar239._0_4_ = uVar133;
  auVar239._8_4_ = uVar133;
  auVar239._12_4_ = uVar133;
  auVar174 = maxps(auVar174,auVar239);
  auVar174 = maxps(auVar222,auVar174);
  local_48 = auVar174._0_4_ * 0.99999964;
  fStack_44 = auVar174._4_4_ * 0.99999964;
  fStack_40 = auVar174._8_4_ * 0.99999964;
  fStack_3c = auVar174._12_4_ * 0.99999964;
  auVar174 = maxps(auVar307,auVar358);
  auVar222 = maxps(auVar367,(undefined1  [16])aVar371);
  auVar174 = minps(auVar174,auVar222);
  auVar222 = maxps(auVar381,(undefined1  [16])aVar391);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar240._4_4_ = uVar133;
  auVar240._0_4_ = uVar133;
  auVar240._8_4_ = uVar133;
  auVar240._12_4_ = uVar133;
  aVar382 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar222,auVar240);
  auVar174 = minps(auVar174,(undefined1  [16])aVar382);
  auVar241._0_4_ = -(uint)(PVar20 != (Primitive)0x0 && local_48 <= auVar174._0_4_ * 1.0000004);
  auVar241._4_4_ = -(uint)(1 < (byte)PVar20 && fStack_44 <= auVar174._4_4_ * 1.0000004);
  auVar241._8_4_ = -(uint)(2 < (byte)PVar20 && fStack_40 <= auVar174._8_4_ * 1.0000004);
  auVar241._12_4_ = -(uint)(3 < (byte)PVar20 && fStack_3c <= auVar174._12_4_ * 1.0000004);
  uVar133 = movmskps((int)unaff_RBP,auVar241);
  local_398 = mm_lookupmask_ps._0_8_;
  uStack_390 = mm_lookupmask_ps._8_8_;
  local_340 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_3b0 = pre;
  local_3a0 = context;
  for (uVar134 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar133); uVar134 != 0;
      uVar134 = (ulong)((uint)uVar134 & (uint)uVar134 + 0xf & uVar138)) {
    lVar129 = 0;
    if (uVar134 != 0) {
      for (; (uVar134 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
      }
    }
    local_3a8 = (ulong)*(uint *)(prim + 2);
    uVar138 = *(uint *)(prim + lVar129 * 4 + 6);
    pGVar26 = (context->scene->geometries).items[local_3a8].ptr;
    uVar135 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                              (ulong)uVar138 *
                              pGVar26[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar411 = pGVar26->fnumTimeSegments;
    fVar144 = (pGVar26->time_range).lower;
    fVar145 = ((*(float *)(ray + k * 4 + 0x70) - fVar144) / ((pGVar26->time_range).upper - fVar144))
              * fVar411;
    fVar144 = floorf(fVar145);
    context = local_3a0;
    fVar411 = fVar411 + -1.0;
    if (fVar411 <= fVar144) {
      fVar144 = fVar411;
    }
    fVar411 = 0.0;
    if (0.0 <= fVar144) {
      fVar411 = fVar144;
    }
    _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar137 = (long)(int)fVar411 * 0x38;
    lVar129 = *(long *)(_Var27 + lVar137);
    lVar132 = *(long *)(_Var27 + 0x10 + lVar137);
    uVar131 = *(ulong *)(_Var27 + 0x38 + lVar137);
    lVar137 = *(long *)(_Var27 + 0x48 + lVar137);
    pRVar130 = (RTCIntersectArguments *)(lVar132 * (uVar135 + 3));
    pfVar1 = (float *)(uVar131 + uVar135 * lVar137);
    pfVar2 = (float *)(lVar129 + lVar132 * uVar135);
    pfVar3 = (float *)(uVar131 + (uVar135 + 1) * lVar137);
    pfVar4 = (float *)(lVar129 + lVar132 * (uVar135 + 1));
    pfVar5 = (float *)(uVar131 + (uVar135 + 2) * lVar137);
    pfVar6 = (float *)(lVar129 + lVar132 * (uVar135 + 2));
    fVar145 = fVar145 - fVar411;
    fVar411 = 1.0 - fVar145;
    fVar399 = *pfVar2 * fVar411 + *pfVar1 * fVar145;
    fVar425 = pfVar2[1] * fVar411 + pfVar1[1] * fVar145;
    fVar352 = pfVar2[2] * fVar411 + pfVar1[2] * fVar145;
    fVar354 = pfVar2[3] * fVar411 + pfVar1[3] * fVar145;
    fVar412 = *pfVar4 * fVar411 + *pfVar3 * fVar145;
    fVar413 = pfVar4[1] * fVar411 + pfVar3[1] * fVar145;
    fVar414 = pfVar4[2] * fVar411 + pfVar3[2] * fVar145;
    fVar433 = pfVar4[3] * fVar411 + pfVar3[3] * fVar145;
    pfVar1 = (float *)(uVar131 + lVar137 * (uVar135 + 3));
    pfVar2 = (float *)((long)&pRVar130->flags + lVar129);
    fVar356 = *pfVar6 * fVar411 + *pfVar5 * fVar145;
    fVar361 = pfVar6[1] * fVar411 + pfVar5[1] * fVar145;
    fVar363 = pfVar6[2] * fVar411 + pfVar5[2] * fVar145;
    fVar365 = pfVar6[3] * fVar411 + pfVar5[3] * fVar145;
    fVar400 = fVar411 * *pfVar2 + fVar145 * *pfVar1;
    fVar401 = fVar411 * pfVar2[1] + fVar145 * pfVar1[1];
    fVar403 = fVar411 * pfVar2[2] + fVar145 * pfVar1[2];
    fVar410 = fVar411 * pfVar2[3] + fVar145 * pfVar1[3];
    iVar285 = (int)pGVar26[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar411 = *(float *)(ray + k * 4);
    fVar144 = *(float *)(ray + k * 4 + 0x10);
    fVar145 = *(float *)(ray + k * 4 + 0x20);
    fVar318 = fVar399 - fVar411;
    fVar319 = fVar425 - fVar144;
    fVar322 = fVar352 - fVar145;
    fVar205 = pre->ray_space[k].vx.field_0.m128[0];
    fVar210 = pre->ray_space[k].vx.field_0.m128[1];
    fVar214 = pre->ray_space[k].vx.field_0.m128[2];
    fVar220 = pre->ray_space[k].vy.field_0.m128[0];
    fVar252 = pre->ray_space[k].vy.field_0.m128[1];
    fVar254 = pre->ray_space[k].vy.field_0.m128[2];
    fVar295 = pre->ray_space[k].vz.field_0.m128[0];
    fVar305 = pre->ray_space[k].vz.field_0.m128[1];
    fVar317 = pre->ray_space[k].vz.field_0.m128[2];
    fVar331 = fVar318 * fVar205 + fVar319 * fVar220 + fVar322 * fVar295;
    fVar372 = fVar318 * fVar210 + fVar319 * fVar252 + fVar322 * fVar305;
    fVar385 = fVar318 * fVar214 + fVar319 * fVar254 + fVar322 * fVar317;
    fVar318 = fVar412 - fVar411;
    fVar319 = fVar413 - fVar144;
    fVar322 = fVar414 - fVar145;
    fVar350 = fVar318 * fVar205 + fVar319 * fVar220 + fVar322 * fVar295;
    local_378 = fVar318 * fVar210 + fVar319 * fVar252 + fVar322 * fVar305;
    fVar409 = fVar318 * fVar214 + fVar319 * fVar254 + fVar322 * fVar317;
    fVar318 = fVar356 - fVar411;
    fVar319 = fVar361 - fVar144;
    fVar322 = fVar363 - fVar145;
    fVar347 = fVar318 * fVar205 + fVar319 * fVar220 + fVar322 * fVar295;
    local_358 = fVar318 * fVar210 + fVar319 * fVar252 + fVar322 * fVar305;
    local_368 = fVar318 * fVar214 + fVar319 * fVar254 + fVar322 * fVar317;
    fVar411 = fVar400 - fVar411;
    fVar144 = fVar401 - fVar144;
    fVar145 = fVar403 - fVar145;
    fVar205 = fVar411 * fVar205 + fVar144 * fVar220 + fVar145 * fVar295;
    fVar210 = fVar411 * fVar210 + fVar144 * fVar252 + fVar145 * fVar305;
    fVar144 = fVar411 * fVar214 + fVar144 * fVar254 + fVar145 * fVar317;
    auVar392._0_8_ = CONCAT44(fVar372,fVar331) & 0x7fffffff7fffffff;
    auVar392._8_4_ = ABS(fVar385);
    auVar392._12_4_ = ABS(fVar354);
    auVar308._0_8_ = CONCAT44(local_378,fVar350) & 0x7fffffff7fffffff;
    auVar308._8_4_ = ABS(fVar409);
    auVar308._12_4_ = ABS(fVar433);
    auVar222 = maxps(auVar392,auVar308);
    auVar325._0_8_ = CONCAT44(local_358,fVar347) & 0x7fffffff7fffffff;
    auVar325._8_4_ = ABS(local_368);
    auVar325._12_4_ = ABS(fVar365);
    auVar242._0_8_ = CONCAT44(fVar210,fVar205) & 0x7fffffff7fffffff;
    auVar242._8_4_ = ABS(fVar144);
    auVar242._12_4_ = ABS(fVar410);
    auVar174 = maxps(auVar325,auVar242);
    auVar174 = maxps(auVar222,auVar174);
    uVar217 = auVar174._8_8_;
    fVar411 = auVar174._4_4_;
    if (auVar174._4_4_ <= auVar174._0_4_) {
      fVar411 = auVar174._0_4_;
    }
    fVar145 = (float)iVar285;
    auVar393._8_8_ = uVar217;
    auVar393._0_8_ = uVar217;
    if (auVar174._8_4_ <= fVar411) {
      auVar394._4_12_ = auVar393._4_12_;
      auVar394._0_4_ = fVar411;
      uVar217 = auVar394._0_8_;
    }
    lVar129 = (long)iVar285 * 0x44;
    fVar214 = *(float *)(bezier_basis0 + lVar129 + 0x908);
    fVar220 = *(float *)(bezier_basis0 + lVar129 + 0x90c);
    fVar252 = *(float *)(bezier_basis0 + lVar129 + 0x910);
    fVar254 = *(float *)(bezier_basis0 + lVar129 + 0x914);
    fVar411 = *(float *)*(undefined1 (*) [12])(bezier_basis0 + lVar129 + 0xd8c);
    fVar295 = *(float *)(bezier_basis0 + lVar129 + 0xd90);
    fVar305 = *(float *)(bezier_basis0 + lVar129 + 0xd94);
    auVar63 = *(undefined1 (*) [12])(bezier_basis0 + lVar129 + 0xd8c);
    fVar317 = *(float *)(bezier_basis0 + lVar129 + 0xd98);
    fVar318 = *(float *)(bezier_basis0 + lVar129 + 0x484);
    fVar319 = *(float *)(bezier_basis0 + lVar129 + 0x488);
    fVar322 = *(float *)(bezier_basis0 + lVar129 + 0x48c);
    fVar337 = *(float *)(bezier_basis0 + lVar129 + 0x490);
    local_388 = *(float *)(bezier_basis0 + lVar129);
    fStack_384 = *(float *)(bezier_basis0 + lVar129 + 4);
    fStack_380 = *(float *)(bezier_basis0 + lVar129 + 8);
    fStack_37c = *(float *)(bezier_basis0 + lVar129 + 0xc);
    fVar287 = fVar331 * local_388 + fVar350 * fVar318 + fVar347 * fVar214 + fVar205 * fVar411;
    fVar296 = fVar331 * fStack_384 + fVar350 * fVar319 + fVar347 * fVar220 + fVar205 * fVar295;
    fVar299 = fVar331 * fStack_380 + fVar350 * fVar322 + fVar347 * fVar252 + fVar205 * fVar305;
    fVar302 = fVar331 * fStack_37c + fVar350 * fVar337 + fVar347 * fVar254 + fVar205 * fVar317;
    fVar422 = fVar372 * local_388 + local_378 * fVar318 + local_358 * fVar214 + fVar210 * fVar411;
    fVar426 = fVar372 * fStack_384 + local_378 * fVar319 + local_358 * fVar220 + fVar210 * fVar295;
    fVar430 = fVar372 * fStack_380 + local_378 * fVar322 + local_358 * fVar252 + fVar210 * fVar305;
    fVar434 = fVar372 * fStack_37c + local_378 * fVar337 + local_358 * fVar254 + fVar210 * fVar317;
    fVar323 = fVar354 * local_388 + fVar433 * fVar318 + fVar365 * fVar214 + fVar410 * fVar411;
    fVar332 = fVar354 * fStack_384 + fVar433 * fVar319 + fVar365 * fVar220 + fVar410 * fVar295;
    auVar359._4_4_ = fVar332;
    auVar359._0_4_ = fVar323;
    fVar334 = fVar354 * fStack_380 + fVar433 * fVar322 + fVar365 * fVar252 + fVar410 * fVar305;
    fVar335 = fVar354 * fStack_37c + fVar433 * fVar337 + fVar365 * fVar254 + fVar410 * fVar317;
    fVar411 = *(float *)*(undefined1 (*) [12])(bezier_basis1 + lVar129 + 0xd8c);
    fVar295 = *(float *)(bezier_basis1 + lVar129 + 0xd90);
    fVar305 = *(float *)(bezier_basis1 + lVar129 + 0xd94);
    auVar66 = *(undefined1 (*) [12])(bezier_basis1 + lVar129 + 0xd8c);
    fVar342 = *(float *)(bezier_basis1 + lVar129 + 0xd98);
    fVar344 = *(float *)(bezier_basis1 + lVar129 + 0x908);
    fVar346 = *(float *)(bezier_basis1 + lVar129 + 0x90c);
    fVar289 = *(float *)(bezier_basis1 + lVar129 + 0x910);
    fVar357 = *(float *)(bezier_basis1 + lVar129 + 0x914);
    fVar298 = *(float *)(bezier_basis1 + lVar129 + 0x484);
    fVar362 = *(float *)(bezier_basis1 + lVar129 + 0x488);
    fVar301 = *(float *)(bezier_basis1 + lVar129 + 0x48c);
    fVar364 = *(float *)(bezier_basis1 + lVar129 + 0x490);
    fVar304 = *(float *)(bezier_basis1 + lVar129);
    fVar366 = *(float *)(bezier_basis1 + lVar129 + 4);
    fVar424 = *(float *)(bezier_basis1 + lVar129 + 8);
    fVar429 = *(float *)(bezier_basis1 + lVar129 + 0xc);
    fVar348 = fVar331 * fVar304 + fVar350 * fVar298 + fVar347 * fVar344 + fVar205 * fVar411;
    fVar351 = fVar331 * fVar366 + fVar350 * fVar362 + fVar347 * fVar346 + fVar205 * fVar295;
    fVar353 = fVar331 * fVar424 + fVar350 * fVar301 + fVar347 * fVar289 + fVar205 * fVar305;
    fVar355 = fVar331 * fVar429 + fVar350 * fVar364 + fVar347 * fVar357 + fVar205 * fVar342;
    fVar146 = fVar372 * fVar304 + local_378 * fVar298 + local_358 * fVar344 + fVar210 * fVar411;
    fVar211 = fVar372 * fVar366 + local_378 * fVar362 + local_358 * fVar346 + fVar210 * fVar295;
    fVar215 = fVar372 * fVar424 + local_378 * fVar301 + local_358 * fVar289 + fVar210 * fVar305;
    fVar218 = fVar372 * fVar429 + local_378 * fVar364 + local_358 * fVar357 + fVar210 * fVar342;
    auVar395._0_4_ = fVar354 * fVar304 + fVar433 * fVar298 + fVar365 * fVar344 + fVar410 * fVar411;
    auVar395._4_4_ = fVar354 * fVar366 + fVar433 * fVar362 + fVar365 * fVar346 + fVar410 * fVar295;
    auVar395._8_4_ = fVar354 * fVar424 + fVar433 * fVar301 + fVar365 * fVar289 + fVar410 * fVar305;
    auVar395._12_4_ = fVar354 * fVar429 + fVar433 * fVar364 + fVar365 * fVar357 + fVar410 * fVar342;
    fVar336 = fVar348 - fVar287;
    fVar341 = fVar351 - fVar296;
    fVar343 = fVar353 - fVar299;
    fVar345 = fVar355 - fVar302;
    fVar295 = fVar146 - fVar422;
    fVar305 = fVar211 - fVar426;
    fVar320 = fVar215 - fVar430;
    fVar321 = fVar218 - fVar434;
    fVar411 = fVar422 * fVar336 - fVar287 * fVar295;
    fVar427 = fVar426 * fVar341 - fVar296 * fVar305;
    fVar431 = fVar430 * fVar343 - fVar299 * fVar320;
    fVar435 = fVar434 * fVar345 - fVar302 * fVar321;
    auVar359._8_4_ = fVar334;
    auVar359._12_4_ = fVar335;
    auVar174 = maxps(auVar359,auVar395);
    bVar100 = fVar411 * fVar411 <=
              auVar174._0_4_ * auVar174._0_4_ * (fVar336 * fVar336 + fVar295 * fVar295) &&
              0.0 < fVar145;
    bVar101 = fVar427 * fVar427 <=
              auVar174._4_4_ * auVar174._4_4_ * (fVar341 * fVar341 + fVar305 * fVar305) &&
              1.0 < fVar145;
    bVar95 = fVar431 * fVar431 <=
             auVar174._8_4_ * auVar174._8_4_ * (fVar343 * fVar343 + fVar320 * fVar320) &&
             2.0 < fVar145;
    bVar90 = fVar435 * fVar435 <=
             auVar174._12_4_ * auVar174._12_4_ * (fVar345 * fVar345 + fVar321 * fVar321) &&
             3.0 < fVar145;
    local_428 = (float)uVar217;
    local_428 = local_428 * 4.7683716e-07;
    auVar28._4_4_ = -(uint)bVar101;
    auVar28._0_4_ = -(uint)bVar100;
    auVar28._8_4_ = -(uint)bVar95;
    auVar28._12_4_ = -(uint)bVar90;
    iVar206 = movmskps((int)(pre->ray_space + k),auVar28);
    fVar411 = *(float *)(ray + k * 4 + 0x30);
    fStack_374 = local_378;
    fStack_370 = local_378;
    fStack_36c = local_378;
    fStack_364 = local_368;
    fStack_360 = local_368;
    fStack_35c = local_368;
    fStack_354 = local_358;
    fStack_350 = local_358;
    fStack_34c = local_358;
    if (iVar206 == 0) {
      bVar136 = 0;
    }
    else {
      local_4f8 = auVar66._0_4_;
      fStack_4f4 = auVar66._4_4_;
      fStack_4f0 = auVar66._8_4_;
      fVar147 = local_4f8 * fVar144 + fVar344 * local_368 + fVar298 * fVar409 + fVar304 * fVar385;
      fVar212 = fStack_4f4 * fVar144 + fVar346 * local_368 + fVar362 * fVar409 + fVar366 * fVar385;
      fVar216 = fStack_4f0 * fVar144 + fVar289 * local_368 + fVar301 * fVar409 + fVar424 * fVar385;
      fVar219 = fVar342 * fVar144 + fVar357 * local_368 + fVar364 * fVar409 + fVar429 * fVar385;
      local_4c8 = auVar63._0_4_;
      fStack_4c4 = auVar63._4_4_;
      fStack_4c0 = auVar63._8_4_;
      fVar288 = local_4c8 * fVar144 + fVar214 * local_368 + fVar318 * fVar409 + local_388 * fVar385;
      fVar297 = fStack_4c4 * fVar144 + fVar220 * local_368 + fVar319 * fVar409 +
                fStack_384 * fVar385;
      fVar300 = fStack_4c0 * fVar144 + fVar252 * local_368 + fVar322 * fVar409 +
                fStack_380 * fVar385;
      fVar303 = fVar317 * fVar144 + fVar254 * local_368 + fVar337 * fVar409 + fStack_37c * fVar385;
      fVar214 = *(float *)(bezier_basis0 + lVar129 + 0x1210);
      fVar220 = *(float *)(bezier_basis0 + lVar129 + 0x1214);
      fVar252 = *(float *)(bezier_basis0 + lVar129 + 0x1218);
      fVar254 = *(float *)(bezier_basis0 + lVar129 + 0x121c);
      fVar317 = *(float *)(bezier_basis0 + lVar129 + 0x1694);
      fVar318 = *(float *)(bezier_basis0 + lVar129 + 0x1698);
      fVar319 = *(float *)(bezier_basis0 + lVar129 + 0x169c);
      fVar322 = *(float *)(bezier_basis0 + lVar129 + 0x16a0);
      fVar337 = *(float *)(bezier_basis0 + lVar129 + 0x1b18);
      fVar342 = *(float *)(bezier_basis0 + lVar129 + 0x1b1c);
      fVar344 = *(float *)(bezier_basis0 + lVar129 + 0x1b20);
      fVar346 = *(float *)(bezier_basis0 + lVar129 + 0x1b24);
      fVar289 = *(float *)(bezier_basis0 + lVar129 + 0x1f9c);
      fVar357 = *(float *)(bezier_basis0 + lVar129 + 0x1fa0);
      fVar298 = *(float *)(bezier_basis0 + lVar129 + 0x1fa4);
      fVar362 = *(float *)(bezier_basis0 + lVar129 + 0x1fa8);
      fVar369 = fVar331 * fVar214 + fVar350 * fVar317 + fVar347 * fVar337 + fVar205 * fVar289;
      fVar373 = fVar331 * fVar220 + fVar350 * fVar318 + fVar347 * fVar342 + fVar205 * fVar357;
      fVar375 = fVar331 * fVar252 + fVar350 * fVar319 + fVar347 * fVar344 + fVar205 * fVar298;
      fVar377 = fVar331 * fVar254 + fVar350 * fVar322 + fVar347 * fVar346 + fVar205 * fVar362;
      fVar423 = fVar372 * fVar214 + local_378 * fVar317 + local_358 * fVar337 + fVar210 * fVar289;
      fVar428 = fVar372 * fVar220 + local_378 * fVar318 + local_358 * fVar342 + fVar210 * fVar357;
      fVar432 = fVar372 * fVar252 + local_378 * fVar319 + local_358 * fVar344 + fVar210 * fVar298;
      fVar436 = fVar372 * fVar254 + local_378 * fVar322 + local_358 * fVar346 + fVar210 * fVar362;
      fVar301 = *(float *)(bezier_basis1 + lVar129 + 0x1210);
      fVar364 = *(float *)(bezier_basis1 + lVar129 + 0x1214);
      fVar304 = *(float *)(bezier_basis1 + lVar129 + 0x1218);
      fVar366 = *(float *)(bezier_basis1 + lVar129 + 0x121c);
      fVar424 = *(float *)(bezier_basis1 + lVar129 + 0x1b18);
      fVar429 = *(float *)(bezier_basis1 + lVar129 + 0x1b1c);
      fVar427 = *(float *)(bezier_basis1 + lVar129 + 0x1b20);
      fVar431 = *(float *)(bezier_basis1 + lVar129 + 0x1b24);
      fVar435 = *(float *)(bezier_basis1 + lVar129 + 0x1f9c);
      fVar374 = *(float *)(bezier_basis1 + lVar129 + 0x1fa0);
      fVar376 = *(float *)(bezier_basis1 + lVar129 + 0x1fa4);
      fVar378 = *(float *)(bezier_basis1 + lVar129 + 0x1fa8);
      fVar379 = *(float *)(bezier_basis1 + lVar129 + 0x1694);
      fVar386 = *(float *)(bezier_basis1 + lVar129 + 0x1698);
      fVar387 = *(float *)(bezier_basis1 + lVar129 + 0x169c);
      fVar388 = *(float *)(bezier_basis1 + lVar129 + 0x16a0);
      fVar415 = fVar331 * fVar301 + fVar350 * fVar379 + fVar347 * fVar424 + fVar205 * fVar435;
      fVar419 = fVar331 * fVar364 + fVar350 * fVar386 + fVar347 * fVar429 + fVar205 * fVar374;
      fVar420 = fVar331 * fVar304 + fVar350 * fVar387 + fVar347 * fVar427 + fVar205 * fVar376;
      fVar421 = fVar331 * fVar366 + fVar350 * fVar388 + fVar347 * fVar431 + fVar205 * fVar378;
      fVar221 = fVar372 * fVar301 + local_378 * fVar379 + local_358 * fVar424 + fVar210 * fVar435;
      fVar253 = fVar372 * fVar364 + local_378 * fVar386 + local_358 * fVar429 + fVar210 * fVar374;
      fVar255 = fVar372 * fVar304 + local_378 * fVar387 + local_358 * fVar427 + fVar210 * fVar376;
      fVar256 = fVar372 * fVar366 + local_378 * fVar388 + local_358 * fVar431 + fVar210 * fVar378;
      auVar396._0_8_ = CONCAT44(fVar373,fVar369) & 0x7fffffff7fffffff;
      auVar396._8_4_ = ABS(fVar375);
      auVar396._12_4_ = ABS(fVar377);
      auVar360._0_8_ = CONCAT44(fVar428,fVar423) & 0x7fffffff7fffffff;
      auVar360._8_4_ = ABS(fVar432);
      auVar360._12_4_ = ABS(fVar436);
      auVar174 = maxps(auVar396,auVar360);
      auVar405._0_8_ =
           CONCAT44(fVar220 * fVar385 + fVar318 * fVar409 + fVar342 * local_368 + fVar357 * fVar144,
                    fVar214 * fVar385 + fVar317 * fVar409 + fVar337 * local_368 + fVar289 * fVar144)
           & 0x7fffffff7fffffff;
      auVar405._8_4_ =
           ABS(fVar252 * fVar385 + fVar319 * fVar409 + fVar344 * local_368 + fVar298 * fVar144);
      auVar405._12_4_ =
           ABS(fVar254 * fVar385 + fVar322 * fVar409 + fVar346 * local_368 + fVar362 * fVar144);
      auVar174 = maxps(auVar174,auVar405);
      uVar139 = -(uint)(local_428 <= auVar174._0_4_);
      uVar140 = -(uint)(local_428 <= auVar174._4_4_);
      uVar141 = -(uint)(local_428 <= auVar174._8_4_);
      uVar142 = -(uint)(local_428 <= auVar174._12_4_);
      fVar317 = (float)((uint)fVar369 & uVar139 | ~uVar139 & (uint)fVar336);
      fVar318 = (float)((uint)fVar373 & uVar140 | ~uVar140 & (uint)fVar341);
      fVar319 = (float)((uint)fVar375 & uVar141 | ~uVar141 & (uint)fVar343);
      fVar322 = (float)((uint)fVar377 & uVar142 | ~uVar142 & (uint)fVar345);
      auVar61._4_4_ = fVar305;
      auVar61._0_4_ = fVar295;
      auVar61._8_4_ = fVar320;
      auVar61._12_4_ = fVar321;
      fVar337 = (float)(~uVar139 & (uint)fVar295 | (uint)fVar423 & uVar139);
      fVar342 = (float)(~uVar140 & (uint)fVar305 | (uint)fVar428 & uVar140);
      fVar344 = (float)(~uVar141 & (uint)fVar320 | (uint)fVar432 & uVar141);
      fVar346 = (float)(~uVar142 & (uint)fVar321 | (uint)fVar436 & uVar142);
      auVar406._0_8_ = CONCAT44(fVar419,fVar415) & 0x7fffffff7fffffff;
      auVar406._8_4_ = ABS(fVar420);
      auVar406._12_4_ = ABS(fVar421);
      auVar368._0_8_ = CONCAT44(fVar253,fVar221) & 0x7fffffff7fffffff;
      auVar368._8_4_ = ABS(fVar255);
      auVar368._12_4_ = ABS(fVar256);
      auVar174 = maxps(auVar406,auVar368);
      auVar338._0_8_ =
           CONCAT44(fVar364 * fVar385 + fVar386 * fVar409 + fVar429 * local_368 + fVar374 * fVar144,
                    fVar301 * fVar385 + fVar379 * fVar409 + fVar424 * local_368 + fVar435 * fVar144)
           & 0x7fffffff7fffffff;
      auVar338._8_4_ =
           ABS(fVar304 * fVar385 + fVar387 * fVar409 + fVar427 * local_368 + fVar376 * fVar144);
      auVar338._12_4_ =
           ABS(fVar366 * fVar385 + fVar388 * fVar409 + fVar431 * local_368 + fVar378 * fVar144);
      auVar174 = maxps(auVar174,auVar338);
      uVar139 = -(uint)(local_428 <= auVar174._0_4_);
      uVar140 = -(uint)(local_428 <= auVar174._4_4_);
      uVar141 = -(uint)(local_428 <= auVar174._8_4_);
      uVar142 = -(uint)(local_428 <= auVar174._12_4_);
      fVar301 = (float)((uint)fVar415 & uVar139 | ~uVar139 & (uint)fVar336);
      fVar364 = (float)((uint)fVar419 & uVar140 | ~uVar140 & (uint)fVar341);
      fVar304 = (float)((uint)fVar420 & uVar141 | ~uVar141 & (uint)fVar343);
      fVar366 = (float)((uint)fVar421 & uVar142 | ~uVar142 & (uint)fVar345);
      fVar289 = (float)(~uVar139 & (uint)fVar295 | (uint)fVar221 & uVar139);
      fVar357 = (float)(~uVar140 & (uint)fVar305 | (uint)fVar253 & uVar140);
      fVar298 = (float)(~uVar141 & (uint)fVar320 | (uint)fVar255 & uVar141);
      fVar362 = (float)(~uVar142 & (uint)fVar321 | (uint)fVar256 & uVar142);
      auVar243._0_4_ = fVar337 * fVar337 + fVar317 * fVar317;
      auVar243._4_4_ = fVar342 * fVar342 + fVar318 * fVar318;
      auVar243._8_4_ = fVar344 * fVar344 + fVar319 * fVar319;
      auVar243._12_4_ = fVar346 * fVar346 + fVar322 * fVar322;
      auVar174 = rsqrtps(auVar61,auVar243);
      fVar214 = auVar174._0_4_;
      fVar220 = auVar174._4_4_;
      fVar252 = auVar174._8_4_;
      fVar254 = auVar174._12_4_;
      auVar309._0_4_ = fVar214 * fVar214 * auVar243._0_4_ * 0.5 * fVar214;
      auVar309._4_4_ = fVar220 * fVar220 * auVar243._4_4_ * 0.5 * fVar220;
      auVar309._8_4_ = fVar252 * fVar252 * auVar243._8_4_ * 0.5 * fVar252;
      auVar309._12_4_ = fVar254 * fVar254 * auVar243._12_4_ * 0.5 * fVar254;
      fVar424 = fVar214 * 1.5 - auVar309._0_4_;
      fVar429 = fVar220 * 1.5 - auVar309._4_4_;
      fVar336 = fVar252 * 1.5 - auVar309._8_4_;
      fVar341 = fVar254 * 1.5 - auVar309._12_4_;
      auVar244._0_4_ = fVar289 * fVar289 + fVar301 * fVar301;
      auVar244._4_4_ = fVar357 * fVar357 + fVar364 * fVar364;
      auVar244._8_4_ = fVar298 * fVar298 + fVar304 * fVar304;
      auVar244._12_4_ = fVar362 * fVar362 + fVar366 * fVar366;
      auVar174 = rsqrtps(auVar309,auVar244);
      fVar214 = auVar174._0_4_;
      fVar220 = auVar174._4_4_;
      fVar252 = auVar174._8_4_;
      fVar254 = auVar174._12_4_;
      fVar214 = fVar214 * 1.5 - fVar214 * fVar214 * auVar244._0_4_ * 0.5 * fVar214;
      fVar220 = fVar220 * 1.5 - fVar220 * fVar220 * auVar244._4_4_ * 0.5 * fVar220;
      fVar252 = fVar252 * 1.5 - fVar252 * fVar252 * auVar244._8_4_ * 0.5 * fVar252;
      fVar254 = fVar254 * 1.5 - fVar254 * fVar254 * auVar244._12_4_ * 0.5 * fVar254;
      fVar221 = fVar337 * fVar424 * fVar323;
      fVar255 = fVar342 * fVar429 * fVar332;
      fVar369 = fVar344 * fVar336 * fVar334;
      fVar375 = fVar346 * fVar341 * fVar335;
      fVar337 = -fVar317 * fVar424 * fVar323;
      fVar342 = -fVar318 * fVar429 * fVar332;
      fVar344 = -fVar319 * fVar336 * fVar334;
      fVar346 = -fVar322 * fVar341 * fVar335;
      fVar423 = fVar424 * 0.0 * fVar323;
      fVar428 = fVar429 * 0.0 * fVar332;
      fVar432 = fVar336 * 0.0 * fVar334;
      fVar436 = fVar341 * 0.0 * fVar335;
      fVar415 = fVar289 * fVar214 * auVar395._0_4_;
      fVar419 = fVar357 * fVar220 * auVar395._4_4_;
      fVar420 = fVar298 * fVar252 * auVar395._8_4_;
      fVar421 = fVar362 * fVar254 * auVar395._12_4_;
      fVar435 = fVar348 + fVar415;
      fVar374 = fVar351 + fVar419;
      fVar376 = fVar353 + fVar420;
      fVar378 = fVar355 + fVar421;
      fVar424 = -fVar301 * fVar214 * auVar395._0_4_;
      fVar429 = -fVar364 * fVar220 * auVar395._4_4_;
      fVar427 = -fVar304 * fVar252 * auVar395._8_4_;
      fVar431 = -fVar366 * fVar254 * auVar395._12_4_;
      fVar379 = fVar146 + fVar424;
      fVar386 = fVar211 + fVar429;
      fVar387 = fVar215 + fVar427;
      fVar388 = fVar218 + fVar431;
      fVar357 = fVar214 * 0.0 * auVar395._0_4_;
      fVar362 = fVar220 * 0.0 * auVar395._4_4_;
      fVar364 = fVar252 * 0.0 * auVar395._8_4_;
      fVar366 = fVar254 * 0.0 * auVar395._12_4_;
      fVar336 = fVar287 - fVar221;
      fVar341 = fVar296 - fVar255;
      fVar343 = fVar299 - fVar369;
      fVar345 = fVar302 - fVar375;
      fVar253 = fVar147 + fVar357;
      fVar256 = fVar212 + fVar362;
      fVar373 = fVar216 + fVar364;
      fVar377 = fVar219 + fVar366;
      fVar317 = fVar422 - fVar337;
      fVar318 = fVar426 - fVar342;
      fVar319 = fVar430 - fVar344;
      fVar322 = fVar434 - fVar346;
      fVar289 = fVar288 - fVar423;
      fVar298 = fVar297 - fVar428;
      fVar301 = fVar300 - fVar432;
      fVar304 = fVar303 - fVar436;
      uVar139 = -(uint)(0.0 < (fVar317 * (fVar253 - fVar289) - fVar289 * (fVar379 - fVar317)) * 0.0
                              + (fVar289 * (fVar435 - fVar336) - (fVar253 - fVar289) * fVar336) *
                                0.0 + ((fVar379 - fVar317) * fVar336 - (fVar435 - fVar336) * fVar317
                                      ));
      uVar140 = -(uint)(0.0 < (fVar318 * (fVar256 - fVar298) - fVar298 * (fVar386 - fVar318)) * 0.0
                              + (fVar298 * (fVar374 - fVar341) - (fVar256 - fVar298) * fVar341) *
                                0.0 + ((fVar386 - fVar318) * fVar341 - (fVar374 - fVar341) * fVar318
                                      ));
      uVar141 = -(uint)(0.0 < (fVar319 * (fVar373 - fVar301) - fVar301 * (fVar387 - fVar319)) * 0.0
                              + (fVar301 * (fVar376 - fVar343) - (fVar373 - fVar301) * fVar343) *
                                0.0 + ((fVar387 - fVar319) * fVar343 - (fVar376 - fVar343) * fVar319
                                      ));
      uVar142 = -(uint)(0.0 < (fVar322 * (fVar377 - fVar304) - fVar304 * (fVar388 - fVar322)) * 0.0
                              + (fVar304 * (fVar378 - fVar345) - (fVar377 - fVar304) * fVar345) *
                                0.0 + ((fVar388 - fVar322) * fVar345 - (fVar378 - fVar345) * fVar322
                                      ));
      fVar214 = (float)((uint)(fVar348 - fVar415) & uVar139 | ~uVar139 & (uint)(fVar287 + fVar221));
      fVar220 = (float)((uint)(fVar351 - fVar419) & uVar140 | ~uVar140 & (uint)(fVar296 + fVar255));
      fVar252 = (float)((uint)(fVar353 - fVar420) & uVar141 | ~uVar141 & (uint)(fVar299 + fVar369));
      fVar254 = (float)((uint)(fVar355 - fVar421) & uVar142 | ~uVar142 & (uint)(fVar302 + fVar375));
      fVar424 = (float)((uint)(fVar146 - fVar424) & uVar139 | ~uVar139 & (uint)(fVar422 + fVar337));
      fVar429 = (float)((uint)(fVar211 - fVar429) & uVar140 | ~uVar140 & (uint)(fVar426 + fVar342));
      fVar146 = (float)((uint)(fVar215 - fVar427) & uVar141 | ~uVar141 & (uint)(fVar430 + fVar344));
      fVar211 = (float)((uint)(fVar218 - fVar431) & uVar142 | ~uVar142 & (uint)(fVar434 + fVar346));
      fVar147 = (float)((uint)(fVar147 - fVar357) & uVar139 | ~uVar139 & (uint)(fVar288 + fVar423));
      fVar212 = (float)((uint)(fVar212 - fVar362) & uVar140 | ~uVar140 & (uint)(fVar297 + fVar428));
      fVar216 = (float)((uint)(fVar216 - fVar364) & uVar141 | ~uVar141 & (uint)(fVar300 + fVar432));
      fVar219 = (float)((uint)(fVar219 - fVar366) & uVar142 | ~uVar142 & (uint)(fVar303 + fVar436));
      fVar215 = (float)((uint)fVar336 & uVar139 | ~uVar139 & (uint)fVar435);
      fVar218 = (float)((uint)fVar341 & uVar140 | ~uVar140 & (uint)fVar374);
      fVar287 = (float)((uint)fVar343 & uVar141 | ~uVar141 & (uint)fVar376);
      fVar296 = (float)((uint)fVar345 & uVar142 | ~uVar142 & (uint)fVar378);
      fVar337 = (float)((uint)fVar317 & uVar139 | ~uVar139 & (uint)fVar379);
      fVar342 = (float)((uint)fVar318 & uVar140 | ~uVar140 & (uint)fVar386);
      fVar344 = (float)((uint)fVar319 & uVar141 | ~uVar141 & (uint)fVar387);
      fVar346 = (float)((uint)fVar322 & uVar142 | ~uVar142 & (uint)fVar388);
      fVar357 = (float)((uint)fVar289 & uVar139 | ~uVar139 & (uint)fVar253);
      fVar362 = (float)((uint)fVar298 & uVar140 | ~uVar140 & (uint)fVar256);
      fVar364 = (float)((uint)fVar301 & uVar141 | ~uVar141 & (uint)fVar373);
      fVar366 = (float)((uint)fVar304 & uVar142 | ~uVar142 & (uint)fVar377);
      fVar299 = (float)((uint)fVar435 & uVar139 | ~uVar139 & (uint)fVar336) - fVar214;
      fVar302 = (float)((uint)fVar374 & uVar140 | ~uVar140 & (uint)fVar341) - fVar220;
      fVar336 = (float)((uint)fVar376 & uVar141 | ~uVar141 & (uint)fVar343) - fVar252;
      fVar341 = (float)((uint)fVar378 & uVar142 | ~uVar142 & (uint)fVar345) - fVar254;
      fVar343 = (float)((uint)fVar379 & uVar139 | ~uVar139 & (uint)fVar317) - fVar424;
      fVar345 = (float)((uint)fVar386 & uVar140 | ~uVar140 & (uint)fVar318) - fVar429;
      fVar348 = (float)((uint)fVar387 & uVar141 | ~uVar141 & (uint)fVar319) - fVar146;
      fVar351 = (float)((uint)fVar388 & uVar142 | ~uVar142 & (uint)fVar322) - fVar211;
      fVar353 = (float)((uint)fVar253 & uVar139 | ~uVar139 & (uint)fVar289) - fVar147;
      fVar355 = (float)((uint)fVar256 & uVar140 | ~uVar140 & (uint)fVar298) - fVar212;
      fVar422 = (float)((uint)fVar373 & uVar141 | ~uVar141 & (uint)fVar301) - fVar216;
      fVar426 = (float)((uint)fVar377 & uVar142 | ~uVar142 & (uint)fVar304) - fVar219;
      fVar435 = fVar214 - fVar215;
      fVar374 = fVar220 - fVar218;
      fVar376 = fVar252 - fVar287;
      fVar378 = fVar254 - fVar296;
      fVar289 = fVar424 - fVar337;
      fVar298 = fVar429 - fVar342;
      fVar301 = fVar146 - fVar344;
      fVar304 = fVar211 - fVar346;
      fVar317 = fVar147 - fVar357;
      fVar318 = fVar212 - fVar362;
      fVar319 = fVar216 - fVar364;
      fVar322 = fVar219 - fVar366;
      fVar427 = (fVar424 * fVar353 - fVar147 * fVar343) * 0.0 +
                (fVar147 * fVar299 - fVar214 * fVar353) * 0.0 +
                (fVar214 * fVar343 - fVar424 * fVar299);
      fVar430 = (fVar429 * fVar355 - fVar212 * fVar345) * 0.0 +
                (fVar212 * fVar302 - fVar220 * fVar355) * 0.0 +
                (fVar220 * fVar345 - fVar429 * fVar302);
      auVar291._4_4_ = fVar430;
      auVar291._0_4_ = fVar427;
      fVar431 = (fVar146 * fVar422 - fVar216 * fVar348) * 0.0 +
                (fVar216 * fVar336 - fVar252 * fVar422) * 0.0 +
                (fVar252 * fVar348 - fVar146 * fVar336);
      fVar434 = (fVar211 * fVar426 - fVar219 * fVar351) * 0.0 +
                (fVar219 * fVar341 - fVar254 * fVar426) * 0.0 +
                (fVar254 * fVar351 - fVar211 * fVar341);
      auVar416._0_4_ =
           (fVar337 * fVar317 - fVar357 * fVar289) * 0.0 +
           (fVar357 * fVar435 - fVar215 * fVar317) * 0.0 + (fVar215 * fVar289 - fVar337 * fVar435);
      auVar416._4_4_ =
           (fVar342 * fVar318 - fVar362 * fVar298) * 0.0 +
           (fVar362 * fVar374 - fVar218 * fVar318) * 0.0 + (fVar218 * fVar298 - fVar342 * fVar374);
      auVar416._8_4_ =
           (fVar344 * fVar319 - fVar364 * fVar301) * 0.0 +
           (fVar364 * fVar376 - fVar287 * fVar319) * 0.0 + (fVar287 * fVar301 - fVar344 * fVar376);
      auVar416._12_4_ =
           (fVar346 * fVar322 - fVar366 * fVar304) * 0.0 +
           (fVar366 * fVar378 - fVar296 * fVar322) * 0.0 + (fVar296 * fVar304 - fVar346 * fVar378);
      auVar291._8_4_ = fVar431;
      auVar291._12_4_ = fVar434;
      auVar174 = maxps(auVar291,auVar416);
      bVar100 = auVar174._0_4_ <= 0.0 && bVar100;
      auVar292._0_4_ = -(uint)bVar100;
      bVar101 = auVar174._4_4_ <= 0.0 && bVar101;
      auVar292._4_4_ = -(uint)bVar101;
      bVar95 = auVar174._8_4_ <= 0.0 && bVar95;
      auVar292._8_4_ = -(uint)bVar95;
      bVar90 = auVar174._12_4_ <= 0.0 && bVar90;
      auVar292._12_4_ = -(uint)bVar90;
      iVar206 = movmskps(iVar206,auVar292);
      if (iVar206 == 0) {
LAB_0036a55d:
        iVar206 = 0;
        auVar199._8_8_ = uStack_390;
        auVar199._0_8_ = local_398;
      }
      else {
        auVar310._0_4_ = fVar317 * fVar343;
        auVar310._4_4_ = fVar318 * fVar345;
        auVar310._8_4_ = fVar319 * fVar348;
        auVar310._12_4_ = fVar322 * fVar351;
        fVar357 = fVar289 * fVar353 - auVar310._0_4_;
        fVar362 = fVar298 * fVar355 - auVar310._4_4_;
        fVar364 = fVar301 * fVar422 - auVar310._8_4_;
        fVar366 = fVar304 * fVar426 - auVar310._12_4_;
        fVar317 = fVar317 * fVar299 - fVar353 * fVar435;
        fVar337 = fVar318 * fVar302 - fVar355 * fVar374;
        fVar342 = fVar319 * fVar336 - fVar422 * fVar376;
        fVar344 = fVar322 * fVar341 - fVar426 * fVar378;
        fVar289 = fVar435 * fVar343 - fVar289 * fVar299;
        fVar298 = fVar374 * fVar345 - fVar298 * fVar302;
        fVar301 = fVar376 * fVar348 - fVar301 * fVar336;
        fVar304 = fVar378 * fVar351 - fVar304 * fVar341;
        auVar326._0_4_ = fVar357 * 0.0 + fVar317 * 0.0 + fVar289;
        auVar326._4_4_ = fVar362 * 0.0 + fVar337 * 0.0 + fVar298;
        auVar326._8_4_ = fVar364 * 0.0 + fVar342 * 0.0 + fVar301;
        auVar326._12_4_ = fVar366 * 0.0 + fVar344 * 0.0 + fVar304;
        auVar174 = rcpps(auVar310,auVar326);
        fVar318 = auVar174._0_4_;
        fVar319 = auVar174._4_4_;
        fVar322 = auVar174._8_4_;
        fVar346 = auVar174._12_4_;
        fVar318 = (1.0 - auVar326._0_4_ * fVar318) * fVar318 + fVar318;
        fVar319 = (1.0 - auVar326._4_4_ * fVar319) * fVar319 + fVar319;
        fVar322 = (1.0 - auVar326._8_4_ * fVar322) * fVar322 + fVar322;
        fVar346 = (1.0 - auVar326._12_4_ * fVar346) * fVar346 + fVar346;
        fVar317 = (fVar147 * fVar289 + fVar424 * fVar317 + fVar214 * fVar357) * fVar318;
        fVar220 = (fVar212 * fVar298 + fVar429 * fVar337 + fVar220 * fVar362) * fVar319;
        aVar397.v[1] = fVar220;
        aVar397.v[0] = fVar317;
        fVar252 = (fVar216 * fVar301 + fVar146 * fVar342 + fVar252 * fVar364) * fVar322;
        fVar254 = (fVar219 * fVar304 + fVar211 * fVar344 + fVar254 * fVar366) * fVar346;
        fVar214 = *(float *)(ray + k * 4 + 0x80);
        bVar100 = (fVar317 <= fVar214 && fVar411 <= fVar317) && bVar100;
        auVar311._0_4_ = -(uint)bVar100;
        bVar101 = (fVar220 <= fVar214 && fVar411 <= fVar220) && bVar101;
        auVar311._4_4_ = -(uint)bVar101;
        bVar95 = (fVar252 <= fVar214 && fVar411 <= fVar252) && bVar95;
        auVar311._8_4_ = -(uint)bVar95;
        bVar90 = (fVar254 <= fVar214 && fVar411 <= fVar254) && bVar90;
        auVar311._12_4_ = -(uint)bVar90;
        iVar206 = movmskps(iVar206,auVar311);
        if (iVar206 == 0) goto LAB_0036a55d;
        auVar312._0_8_ =
             CONCAT44(-(uint)(auVar326._4_4_ != 0.0 && bVar101),
                      -(uint)(auVar326._0_4_ != 0.0 && bVar100));
        auVar312._8_4_ = -(uint)(auVar326._8_4_ != 0.0 && bVar95);
        auVar312._12_4_ = -(uint)(auVar326._12_4_ != 0.0 && bVar90);
        iVar206 = movmskps(iVar206,auVar312);
        auVar199._8_8_ = uStack_390;
        auVar199._0_8_ = local_398;
        if (iVar206 != 0) {
          fVar427 = fVar427 * fVar318;
          fVar430 = fVar430 * fVar319;
          fVar431 = fVar431 * fVar322;
          fVar434 = fVar434 * fVar346;
          auVar198._0_4_ = ~uVar139 & (uint)fVar427;
          auVar198._4_4_ = ~uVar140 & (uint)fVar430;
          auVar198._8_4_ = ~uVar141 & (uint)fVar431;
          auVar198._12_4_ = ~uVar142 & (uint)fVar434;
          auVar370._0_4_ = (uint)(1.0 - fVar427) & uVar139;
          auVar370._4_4_ = (uint)(1.0 - fVar430) & uVar140;
          auVar370._8_4_ = (uint)(1.0 - fVar431) & uVar141;
          auVar370._12_4_ = (uint)(1.0 - fVar434) & uVar142;
          aVar371 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar370 | auVar198);
          local_278 = (float)(~uVar139 & (uint)(auVar416._0_4_ * fVar318) |
                             (uint)(1.0 - auVar416._0_4_ * fVar318) & uVar139);
          fStack_274 = (float)(~uVar140 & (uint)(auVar416._4_4_ * fVar319) |
                              (uint)(1.0 - auVar416._4_4_ * fVar319) & uVar140);
          fStack_270 = (float)(~uVar141 & (uint)(auVar416._8_4_ * fVar322) |
                              (uint)(1.0 - auVar416._8_4_ * fVar322) & uVar141);
          fStack_26c = (float)(~uVar142 & (uint)(auVar416._12_4_ * fVar346) |
                              (uint)(1.0 - auVar416._12_4_ * fVar346) & uVar142);
          auVar199._8_4_ = auVar312._8_4_;
          auVar199._0_8_ = auVar312._0_8_;
          auVar199._12_4_ = auVar312._12_4_;
          aVar397.v[2] = fVar252;
          aVar397.v[3] = fVar254;
          aVar391 = aVar397;
        }
      }
      iVar206 = movmskps(iVar206,auVar199);
      local_388 = fVar295;
      fStack_384 = fVar305;
      fStack_380 = fVar320;
      fStack_37c = fVar321;
      if (iVar206 == 0) {
        bVar136 = 0;
      }
      else {
        fVar323 = (auVar395._0_4_ - fVar323) * aVar371.v[0] + fVar323;
        fVar332 = (auVar395._4_4_ - fVar332) * aVar371.v[1] + fVar332;
        fVar334 = (auVar395._8_4_ - fVar334) * aVar371.v[2] + fVar334;
        fVar335 = (auVar395._12_4_ - fVar335) * aVar371.v[3] + fVar335;
        fVar214 = *(float *)((long)local_3b0->ray_space + k * 4 + -0x10);
        aVar245._0_4_ = -(uint)(fVar214 * (fVar323 + fVar323) < aVar391.v[0]) & auVar199._0_4_;
        aVar245._4_4_ = -(uint)(fVar214 * (fVar332 + fVar332) < aVar391.v[1]) & auVar199._4_4_;
        aVar245._8_4_ = -(uint)(fVar214 * (fVar334 + fVar334) < aVar391.v[2]) & auVar199._8_4_;
        aVar245._12_4_ = -(uint)(fVar214 * (fVar335 + fVar335) < aVar391.v[3]) & auVar199._12_4_;
        uVar139 = movmskps((int)local_3b0,(undefined1  [16])aVar245);
        if (uVar139 != 0) {
          local_278 = local_278 + local_278 + -1.0;
          fStack_274 = fStack_274 + fStack_274 + -1.0;
          fStack_270 = fStack_270 + fStack_270 + -1.0;
          fStack_26c = fStack_26c + fStack_26c + -1.0;
          bhit.i = 0;
          bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fVar425,fVar399);
          bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fVar354,fVar352);
          bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fVar413,fVar412);
          bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fVar433,fVar414);
          bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fVar361,fVar356);
          bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fVar365,fVar363);
          bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fVar401,fVar400);
          bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fVar410,fVar403);
          pRVar130 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
          bhit.U.field_0 = aVar371;
          bhit.V.field_0.v[0] = local_278;
          bhit.V.field_0.v[1] = fStack_274;
          bhit.V.field_0.v[2] = fStack_270;
          bhit.V.field_0.v[3] = fStack_26c;
          bhit.T.field_0 = aVar391;
          bhit.N = iVar285;
          bhit.valid.field_0 = aVar245;
          if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            pRVar130 = local_3a0->args;
            if ((pRVar130->filter != (RTCFilterFunctionN)0x0) ||
               (bVar136 = 1, pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar214 = 1.0 / fVar145;
              bhit.vu.field_0.v[0] = fVar214 * (aVar371.v[0] + 0.0);
              bhit.vu.field_0.v[1] = fVar214 * (aVar371.v[1] + 1.0);
              bhit.vu.field_0.v[2] = fVar214 * (aVar371.v[2] + 2.0);
              bhit.vu.field_0.v[3] = fVar214 * (aVar371.v[3] + 3.0);
              bhit.vv.field_0._0_8_ = CONCAT44(fStack_274,local_278);
              bhit.vv.field_0._8_8_ = CONCAT44(fStack_26c,fStack_270);
              bhit.vt.field_0 = aVar391;
              uVar131 = (ulong)(uVar139 & 0xff);
              uVar135 = 0;
              if (uVar131 != 0) {
                for (; ((uVar139 & 0xff) >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                }
              }
              local_3e8 = CONCAT44((undefined4)local_3a8,(undefined4)local_3a8);
              uStack_3e0._0_4_ = (undefined4)local_3a8;
              uStack_3e0._4_4_ = (undefined4)local_3a8;
              local_3f8 = CONCAT44(uVar138,uVar138);
              auVar63 = *(undefined1 (*) [12])*local_340;
              uStack_3fc = (undefined4)((ulong)*(undefined8 *)(*local_340 + 8) >> 0x20);
              while (uVar131 != 0) {
                local_f8 = bhit.vu.field_0.v[uVar135];
                uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_e8 = bhit.vv.field_0.v[uVar135];
                *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar135];
                fVar214 = 1.0 - local_f8;
                fVar252 = local_f8 * fVar214 + local_f8 * fVar214;
                fVar254 = (fVar252 - local_f8 * local_f8) * 3.0;
                fVar220 = local_f8 * local_f8 * 3.0;
                fVar252 = (fVar214 * fVar214 - fVar252) * 3.0;
                args.context = context->user;
                fVar214 = fVar214 * fVar214 * -3.0;
                local_128 = fVar214 * fVar399 +
                            fVar252 * fVar412 + fVar254 * fVar356 + fVar220 * fVar400;
                local_118 = fVar214 * fVar425 +
                            fVar252 * fVar413 + fVar254 * fVar361 + fVar220 * fVar401;
                local_108 = fVar214 * fVar352 +
                            fVar252 * fVar414 + fVar254 * fVar363 + fVar220 * fVar403;
                fStack_124 = local_128;
                fStack_120 = local_128;
                fStack_11c = local_128;
                fStack_114 = local_118;
                fStack_110 = local_118;
                fStack_10c = local_118;
                fStack_104 = local_108;
                fStack_100 = local_108;
                fStack_fc = local_108;
                fStack_f4 = local_f8;
                fStack_f0 = local_f8;
                fStack_ec = local_f8;
                fStack_e4 = local_e8;
                fStack_e0 = local_e8;
                fStack_dc = local_e8;
                local_d8 = local_3f8;
                uStack_d0 = CONCAT44(uVar138,uVar138);
                local_c8 = local_3e8;
                uStack_c0 = uStack_3e0;
                local_b8 = (args.context)->instID[0];
                uStack_b4 = local_b8;
                uStack_b0 = local_b8;
                uStack_ac = local_b8;
                local_a8 = (args.context)->instPrimID[0];
                uStack_a4 = local_a8;
                uStack_a0 = local_a8;
                uStack_9c = local_a8;
                local_3c8._12_4_ = uStack_3fc;
                local_3c8._0_12_ = auVar63;
                args.valid = (int *)local_3c8;
                pRVar130 = (RTCIntersectArguments *)pGVar26->userPtr;
                args.hit = (RTCHitN *)&local_128;
                args.N = 4;
                p_Var127 = pGVar26->occlusionFilterN;
                args.geometryUserPtr = pRVar130;
                args.ray = (RTCRayN *)ray;
                if (p_Var127 != (RTCFilterFunctionN)0x0) {
                  p_Var127 = (RTCFilterFunctionN)(*p_Var127)(&args);
                }
                auVar246._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                auVar246._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                auVar246._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                auVar246._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                uVar139 = movmskps((int)p_Var127,auVar246);
                pRVar128 = (RTCRayN *)(ulong)(uVar139 ^ 0xf);
                if ((uVar139 ^ 0xf) == 0) {
                  auVar246 = auVar246 ^ _DAT_01f46b70;
                }
                else {
                  pRVar130 = context->args;
                  if ((pRVar130->filter != (RTCFilterFunctionN)0x0) &&
                     (((pRVar130->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar26->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*pRVar130->filter)(&args);
                  }
                  auVar200._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                  auVar200._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                  auVar200._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                  auVar200._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                  auVar246 = auVar200 ^ _DAT_01f46b70;
                  *(undefined1 (*) [16])(args.ray + 0x80) =
                       ~auVar200 & _DAT_01f45a40 |
                       *(undefined1 (*) [16])(args.ray + 0x80) & auVar200;
                  pRVar128 = args.ray;
                }
                auVar247._0_4_ = auVar246._0_4_ << 0x1f;
                auVar247._4_4_ = auVar246._4_4_ << 0x1f;
                auVar247._8_4_ = auVar246._8_4_ << 0x1f;
                auVar247._12_4_ = auVar246._12_4_ << 0x1f;
                iVar206 = movmskps((int)pRVar128,auVar247);
                if (iVar206 != 0) {
                  bVar136 = 1;
                  goto LAB_003695f6;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar133;
                uVar131 = uVar131 ^ 1L << (uVar135 & 0x3f);
                uVar135 = 0;
                if (uVar131 != 0) {
                  for (; (uVar131 >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                  }
                }
              }
              bVar136 = 0;
            }
            goto LAB_003695f6;
          }
        }
        bVar136 = 0;
      }
    }
LAB_003695f6:
    uVar133 = SUB84(pRVar130,0);
    if (4 < iVar285) {
      local_68 = iVar285;
      iStack_64 = iVar285;
      iStack_60 = iVar285;
      iStack_5c = iVar285;
      local_98 = 1.0 / fVar145;
      fStack_94 = local_98;
      fStack_90 = local_98;
      fStack_8c = local_98;
      local_78 = (undefined4)local_3a8;
      uStack_74 = (undefined4)local_3a8;
      uStack_70 = (undefined4)local_3a8;
      uStack_6c = (undefined4)local_3a8;
      local_88 = uVar138;
      uStack_84 = uVar138;
      uStack_80 = uVar138;
      uStack_7c = uVar138;
      for (lVar132 = 4; uVar133 = SUB84(pRVar130,0), lVar132 < iVar285; lVar132 = lVar132 + 4) {
        uVar139 = (uint)lVar132;
        pRVar130 = (RTCIntersectArguments *)(bezier_basis0 + lVar129);
        pRVar7 = &pRVar130->flags + lVar132;
        fVar145 = (float)*pRVar7;
        fVar214 = (float)pRVar7[1];
        fVar220 = (float)pRVar7[2];
        fVar252 = (float)pRVar7[3];
        pfVar1 = (float *)(lVar129 + 0x21fb768 + lVar132 * 4);
        local_388 = *pfVar1;
        fStack_384 = pfVar1[1];
        fStack_380 = pfVar1[2];
        fStack_37c = pfVar1[3];
        pauVar9 = (undefined1 (*) [12])(lVar129 + 0x21fbbec + lVar132 * 4);
        fVar254 = *(float *)*pauVar9;
        fVar295 = *(float *)(*pauVar9 + 4);
        fVar305 = *(float *)(*pauVar9 + 8);
        auVar63 = *pauVar9;
        fVar317 = *(float *)pauVar9[1];
        pfVar1 = (float *)(lVar129 + 0x21fc070 + lVar132 * 4);
        fVar318 = *pfVar1;
        fVar319 = pfVar1[1];
        fVar322 = pfVar1[2];
        fVar337 = pfVar1[3];
        fVar321 = fVar331 * fVar145 + fVar350 * local_388 + fVar347 * fVar254 + fVar205 * fVar318;
        fVar336 = fVar331 * fVar214 + fVar350 * fStack_384 + fVar347 * fVar295 + fVar205 * fVar319;
        fVar341 = fVar331 * fVar220 + fVar350 * fStack_380 + fVar347 * fVar305 + fVar205 * fVar322;
        fVar343 = fVar331 * fVar252 + fVar350 * fStack_37c + fVar347 * fVar317 + fVar205 * fVar337;
        fVar345 = fVar372 * fVar145 +
                  local_378 * local_388 + local_358 * fVar254 + fVar210 * fVar318;
        fVar351 = fVar372 * fVar214 +
                  fStack_374 * fStack_384 + fStack_354 * fVar295 + fVar210 * fVar319;
        fVar355 = fVar372 * fVar220 +
                  fStack_370 * fStack_380 + fStack_350 * fVar305 + fVar210 * fVar322;
        fVar426 = fVar372 * fVar252 +
                  fStack_36c * fStack_37c + fStack_34c * fVar317 + fVar210 * fVar337;
        auVar249._0_4_ =
             fVar354 * fVar145 + fVar433 * local_388 + fVar365 * fVar254 + fVar410 * fVar318;
        auVar249._4_4_ =
             fVar354 * fVar214 + fVar433 * fStack_384 + fVar365 * fVar295 + fVar410 * fVar319;
        auVar249._8_4_ =
             fVar354 * fVar220 + fVar433 * fStack_380 + fVar365 * fVar305 + fVar410 * fVar322;
        auVar249._12_4_ =
             fVar354 * fVar252 + fVar433 * fStack_37c + fVar365 * fVar317 + fVar410 * fVar337;
        pfVar1 = (float *)(bezier_basis1 + lVar129 + lVar132 * 4);
        fVar254 = *pfVar1;
        fVar295 = pfVar1[1];
        fVar305 = pfVar1[2];
        fVar342 = pfVar1[3];
        pfVar1 = (float *)(lVar129 + 0x21fdb88 + lVar132 * 4);
        fVar344 = *pfVar1;
        fVar346 = pfVar1[1];
        fVar289 = pfVar1[2];
        fVar357 = pfVar1[3];
        pfVar1 = (float *)(lVar129 + 0x21fe00c + lVar132 * 4);
        fVar298 = *pfVar1;
        fVar362 = pfVar1[1];
        fVar301 = pfVar1[2];
        fVar364 = pfVar1[3];
        pauVar9 = (undefined1 (*) [12])(lVar129 + 0x21fe490 + lVar132 * 4);
        fVar304 = *(float *)*pauVar9;
        fVar366 = *(float *)(*pauVar9 + 4);
        fVar424 = *(float *)(*pauVar9 + 8);
        auVar66 = *pauVar9;
        fVar429 = *(float *)pauVar9[1];
        fVar211 = fVar331 * fVar254 + fVar350 * fVar344 + fVar347 * fVar298 + fVar205 * fVar304;
        fVar218 = fVar331 * fVar295 + fVar350 * fVar346 + fVar347 * fVar362 + fVar205 * fVar366;
        fVar323 = fVar331 * fVar305 + fVar350 * fVar289 + fVar347 * fVar301 + fVar205 * fVar424;
        fVar332 = fVar331 * fVar342 + fVar350 * fVar357 + fVar347 * fVar364 + fVar205 * fVar429;
        fVar334 = fVar372 * fVar254 + local_378 * fVar344 + local_358 * fVar298 + fVar210 * fVar304;
        fVar302 = fVar372 * fVar295 +
                  fStack_374 * fVar346 + fStack_354 * fVar362 + fVar210 * fVar366;
        fVar335 = fVar372 * fVar305 +
                  fStack_370 * fVar289 + fStack_350 * fVar301 + fVar210 * fVar424;
        fVar320 = fVar372 * fVar342 +
                  fStack_36c * fVar357 + fStack_34c * fVar364 + fVar210 * fVar429;
        auVar417._0_4_ =
             fVar354 * fVar254 + fVar433 * fVar344 + fVar365 * fVar298 + fVar410 * fVar304;
        auVar417._4_4_ =
             fVar354 * fVar295 + fVar433 * fVar346 + fVar365 * fVar362 + fVar410 * fVar366;
        auVar417._8_4_ =
             fVar354 * fVar305 + fVar433 * fVar289 + fVar365 * fVar301 + fVar410 * fVar424;
        auVar417._12_4_ =
             fVar354 * fVar342 + fVar433 * fVar357 + fVar365 * fVar364 + fVar410 * fVar429;
        fVar215 = fVar211 - fVar321;
        fVar287 = fVar218 - fVar336;
        fVar296 = fVar323 - fVar341;
        fVar299 = fVar332 - fVar343;
        fVar304 = fVar334 - fVar345;
        fVar366 = fVar302 - fVar351;
        fVar424 = fVar335 - fVar355;
        fVar146 = fVar320 - fVar426;
        fVar348 = fVar345 * fVar215 - fVar321 * fVar304;
        fVar353 = fVar351 * fVar287 - fVar336 * fVar366;
        fVar422 = fVar355 * fVar296 - fVar341 * fVar424;
        fVar427 = fVar426 * fVar299 - fVar343 * fVar146;
        auVar174 = maxps(auVar249,auVar417);
        bVar100 = fVar348 * fVar348 <=
                  auVar174._0_4_ * auVar174._0_4_ * (fVar215 * fVar215 + fVar304 * fVar304) &&
                  (int)uVar139 < local_68;
        auVar349._0_4_ = -(uint)bVar100;
        bVar101 = fVar353 * fVar353 <=
                  auVar174._4_4_ * auVar174._4_4_ * (fVar287 * fVar287 + fVar366 * fVar366) &&
                  (int)(uVar139 | 1) < iStack_64;
        auVar349._4_4_ = -(uint)bVar101;
        bVar95 = fVar422 * fVar422 <=
                 auVar174._8_4_ * auVar174._8_4_ * (fVar296 * fVar296 + fVar424 * fVar424) &&
                 (int)(uVar139 | 2) < iStack_60;
        auVar349._8_4_ = -(uint)bVar95;
        bVar90 = fVar427 * fVar427 <=
                 auVar174._12_4_ * auVar174._12_4_ * (fVar299 * fVar299 + fVar146 * fVar146) &&
                 (int)(uVar139 | 3) < iStack_5c;
        auVar349._12_4_ = -(uint)bVar90;
        uVar138 = movmskps((int)uVar131,auVar349);
        uVar131 = (ulong)uVar138;
        if (uVar138 != 0) {
          local_58 = fVar215;
          fStack_54 = fVar287;
          fStack_50 = fVar296;
          fStack_4c = fVar299;
          local_4f8 = auVar66._0_4_;
          fStack_4f4 = auVar66._4_4_;
          fStack_4f0 = auVar66._8_4_;
          fVar378 = local_4f8 * fVar144 + fVar298 * local_368 + fVar344 * fVar409 +
                    fVar254 * fVar385;
          fVar379 = fStack_4f4 * fVar144 + fVar362 * fStack_364 + fVar346 * fVar409 +
                    fVar295 * fVar385;
          fVar386 = fStack_4f0 * fVar144 + fVar301 * fStack_360 + fVar289 * fVar409 +
                    fVar305 * fVar385;
          fVar387 = fVar429 * fVar144 + fVar364 * fStack_35c + fVar357 * fVar409 + fVar342 * fVar385
          ;
          local_2f8 = auVar63._0_4_;
          fStack_2f4 = auVar63._4_4_;
          fStack_2f0 = auVar63._8_4_;
          fVar219 = fVar318 * fVar144 + local_2f8 * local_368 + local_388 * fVar409 +
                    fVar145 * fVar385;
          fVar221 = fVar319 * fVar144 + fStack_2f4 * fStack_364 + fStack_384 * fVar409 +
                    fVar214 * fVar385;
          fVar253 = fVar322 * fVar144 + fStack_2f0 * fStack_360 + fStack_380 * fVar409 +
                    fVar220 * fVar385;
          fVar255 = fVar337 * fVar144 + fVar317 * fStack_35c + fStack_37c * fVar409 +
                    fVar252 * fVar385;
          pfVar1 = (float *)(lVar129 + 0x21fc4f4 + lVar132 * 4);
          fVar145 = *pfVar1;
          fVar214 = pfVar1[1];
          fVar220 = pfVar1[2];
          fVar252 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x21fc978 + lVar132 * 4);
          fVar254 = *pfVar1;
          fVar295 = pfVar1[1];
          fVar305 = pfVar1[2];
          fVar317 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x21fcdfc + lVar132 * 4);
          fVar318 = *pfVar1;
          fVar319 = pfVar1[1];
          fVar322 = pfVar1[2];
          fVar337 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x21fd280 + lVar132 * 4);
          fVar342 = *pfVar1;
          fVar344 = pfVar1[1];
          fVar346 = pfVar1[2];
          fVar289 = pfVar1[3];
          fVar303 = fVar331 * fVar145 + fVar350 * fVar254 + fVar347 * fVar318 + fVar205 * fVar342;
          fVar369 = fVar331 * fVar214 + fVar350 * fVar295 + fVar347 * fVar319 + fVar205 * fVar344;
          fVar373 = fVar331 * fVar220 + fVar350 * fVar305 + fVar347 * fVar322 + fVar205 * fVar346;
          fVar375 = fVar331 * fVar252 + fVar350 * fVar317 + fVar347 * fVar337 + fVar205 * fVar289;
          fVar388 = fVar372 * fVar145 +
                    local_378 * fVar254 + local_358 * fVar318 + fVar210 * fVar342;
          fVar147 = fVar372 * fVar214 +
                    fStack_374 * fVar295 + fStack_354 * fVar319 + fVar210 * fVar344;
          fVar212 = fVar372 * fVar220 +
                    fStack_370 * fVar305 + fStack_350 * fVar322 + fVar210 * fVar346;
          fVar216 = fVar372 * fVar252 +
                    fStack_36c * fVar317 + fStack_34c * fVar337 + fVar210 * fVar289;
          pfVar1 = (float *)(lVar129 + 0x21fe914 + lVar132 * 4);
          fVar357 = *pfVar1;
          fVar298 = pfVar1[1];
          fVar362 = pfVar1[2];
          fVar301 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x21ff21c + lVar132 * 4);
          fVar364 = *pfVar1;
          fVar429 = pfVar1[1];
          fVar348 = pfVar1[2];
          fVar353 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x21ff6a0 + lVar132 * 4);
          fVar422 = *pfVar1;
          fVar427 = pfVar1[1];
          fVar430 = pfVar1[2];
          fVar431 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x21fed98 + lVar132 * 4);
          fVar434 = *pfVar1;
          fVar435 = pfVar1[1];
          fVar374 = pfVar1[2];
          fVar376 = pfVar1[3];
          fVar377 = fVar331 * fVar357 + fVar350 * fVar434 + fVar347 * fVar364 + fVar205 * fVar422;
          fVar415 = fVar331 * fVar298 + fVar350 * fVar435 + fVar347 * fVar429 + fVar205 * fVar427;
          fVar419 = fVar331 * fVar362 + fVar350 * fVar374 + fVar347 * fVar348 + fVar205 * fVar430;
          fVar420 = fVar331 * fVar301 + fVar350 * fVar376 + fVar347 * fVar353 + fVar205 * fVar431;
          fVar256 = fVar372 * fVar357 +
                    local_378 * fVar434 + local_358 * fVar364 + fVar210 * fVar422;
          fVar288 = fVar372 * fVar298 +
                    fStack_374 * fVar435 + fStack_354 * fVar429 + fVar210 * fVar427;
          fVar297 = fVar372 * fVar362 +
                    fStack_370 * fVar374 + fStack_350 * fVar348 + fVar210 * fVar430;
          fVar300 = fVar372 * fVar301 +
                    fStack_36c * fVar376 + fStack_34c * fVar353 + fVar210 * fVar431;
          auVar398._0_8_ = CONCAT44(fVar369,fVar303) & 0x7fffffff7fffffff;
          auVar398._8_4_ = ABS(fVar373);
          auVar398._12_4_ = ABS(fVar375);
          auVar327._0_8_ = CONCAT44(fVar147,fVar388) & 0x7fffffff7fffffff;
          auVar327._8_4_ = ABS(fVar212);
          auVar327._12_4_ = ABS(fVar216);
          auVar174 = maxps(auVar398,auVar327);
          auVar407._0_8_ =
               CONCAT44(fVar214 * fVar385 +
                        fVar295 * fVar409 + fVar319 * fStack_364 + fVar344 * fVar144,
                        fVar145 * fVar385 +
                        fVar254 * fVar409 + fVar318 * local_368 + fVar342 * fVar144) &
               0x7fffffff7fffffff;
          auVar407._8_4_ =
               ABS(fVar220 * fVar385 + fVar305 * fVar409 + fVar322 * fStack_360 + fVar346 * fVar144)
          ;
          auVar407._12_4_ =
               ABS(fVar252 * fVar385 + fVar317 * fVar409 + fVar337 * fStack_35c + fVar289 * fVar144)
          ;
          auVar174 = maxps(auVar174,auVar407);
          uVar138 = -(uint)(local_428 <= auVar174._0_4_);
          uVar140 = -(uint)(local_428 <= auVar174._4_4_);
          uVar141 = -(uint)(local_428 <= auVar174._8_4_);
          uVar142 = -(uint)(local_428 <= auVar174._12_4_);
          auVar328._0_4_ = ~uVar138 & (uint)fVar215;
          auVar328._4_4_ = ~uVar140 & (uint)fVar287;
          auVar328._8_4_ = ~uVar141 & (uint)fVar296;
          auVar328._12_4_ = ~uVar142 & (uint)fVar299;
          auVar383._0_4_ = (uint)fVar303 & uVar138;
          auVar383._4_4_ = (uint)fVar369 & uVar140;
          auVar383._8_4_ = (uint)fVar373 & uVar141;
          auVar383._12_4_ = (uint)fVar375 & uVar142;
          auVar383 = auVar383 | auVar328;
          fVar388 = (float)(~uVar138 & (uint)fVar304 | (uint)fVar388 & uVar138);
          fVar147 = (float)(~uVar140 & (uint)fVar366 | (uint)fVar147 & uVar140);
          fVar212 = (float)(~uVar141 & (uint)fVar424 | (uint)fVar212 & uVar141);
          fVar216 = (float)(~uVar142 & (uint)fVar146 | (uint)fVar216 & uVar142);
          auVar408._0_8_ = CONCAT44(fVar415,fVar377) & 0x7fffffff7fffffff;
          auVar408._8_4_ = ABS(fVar419);
          auVar408._12_4_ = ABS(fVar420);
          auVar280._0_8_ = CONCAT44(fVar288,fVar256) & 0x7fffffff7fffffff;
          auVar280._8_4_ = ABS(fVar297);
          auVar280._12_4_ = ABS(fVar300);
          auVar174 = maxps(auVar408,auVar280);
          auVar201._0_8_ =
               CONCAT44(fVar298 * fVar385 +
                        fVar435 * fVar409 + fVar429 * fStack_364 + fVar427 * fVar144,
                        fVar357 * fVar385 +
                        fVar434 * fVar409 + fVar364 * local_368 + fVar422 * fVar144) &
               0x7fffffff7fffffff;
          auVar201._8_4_ =
               ABS(fVar362 * fVar385 + fVar374 * fVar409 + fVar348 * fStack_360 + fVar430 * fVar144)
          ;
          auVar201._12_4_ =
               ABS(fVar301 * fVar385 + fVar376 * fVar409 + fVar353 * fStack_35c + fVar431 * fVar144)
          ;
          auVar174 = maxps(auVar174,auVar201);
          uVar138 = -(uint)(local_428 <= auVar174._0_4_);
          uVar140 = -(uint)(local_428 <= auVar174._4_4_);
          uVar141 = -(uint)(local_428 <= auVar174._8_4_);
          uVar142 = -(uint)(local_428 <= auVar174._12_4_);
          fVar429 = (float)((uint)fVar377 & uVar138 | ~uVar138 & (uint)fVar215);
          fVar215 = (float)((uint)fVar415 & uVar140 | ~uVar140 & (uint)fVar287);
          fVar287 = (float)((uint)fVar419 & uVar141 | ~uVar141 & (uint)fVar296);
          fVar296 = (float)((uint)fVar420 & uVar142 | ~uVar142 & (uint)fVar299);
          fVar357 = (float)(~uVar138 & (uint)fVar304 | (uint)fVar256 & uVar138);
          fVar362 = (float)(~uVar140 & (uint)fVar366 | (uint)fVar288 & uVar140);
          fVar364 = (float)(~uVar141 & (uint)fVar424 | (uint)fVar297 & uVar141);
          fVar366 = (float)(~uVar142 & (uint)fVar146 | (uint)fVar300 & uVar142);
          fVar317 = auVar383._0_4_;
          fVar145 = auVar383._4_4_;
          fVar214 = auVar383._8_4_;
          fVar220 = auVar383._12_4_;
          auVar313._0_4_ = fVar388 * fVar388 + fVar317 * fVar317;
          auVar313._4_4_ = fVar147 * fVar147 + fVar145 * fVar145;
          auVar313._8_4_ = fVar212 * fVar212 + fVar214 * fVar214;
          auVar313._12_4_ = fVar216 * fVar216 + fVar220 * fVar220;
          auVar174 = rsqrtps(auVar328,auVar313);
          fVar252 = auVar174._0_4_;
          fVar254 = auVar174._4_4_;
          fVar295 = auVar174._8_4_;
          fVar305 = auVar174._12_4_;
          auVar329._0_4_ = fVar252 * fVar252 * auVar313._0_4_ * 0.5 * fVar252;
          auVar329._4_4_ = fVar254 * fVar254 * auVar313._4_4_ * 0.5 * fVar254;
          auVar329._8_4_ = fVar295 * fVar295 * auVar313._8_4_ * 0.5 * fVar295;
          auVar329._12_4_ = fVar305 * fVar305 * auVar313._12_4_ * 0.5 * fVar305;
          fVar342 = fVar252 * 1.5 - auVar329._0_4_;
          fVar344 = fVar254 * 1.5 - auVar329._4_4_;
          fVar346 = fVar295 * 1.5 - auVar329._8_4_;
          fVar289 = fVar305 * 1.5 - auVar329._12_4_;
          auVar314._0_4_ = fVar357 * fVar357 + fVar429 * fVar429;
          auVar314._4_4_ = fVar362 * fVar362 + fVar215 * fVar215;
          auVar314._8_4_ = fVar364 * fVar364 + fVar287 * fVar287;
          auVar314._12_4_ = fVar366 * fVar366 + fVar296 * fVar296;
          auVar174 = rsqrtps(auVar329,auVar314);
          fVar252 = auVar174._0_4_;
          fVar254 = auVar174._4_4_;
          fVar295 = auVar174._8_4_;
          fVar305 = auVar174._12_4_;
          fVar318 = fVar252 * 1.5 - fVar252 * fVar252 * auVar314._0_4_ * 0.5 * fVar252;
          fVar319 = fVar254 * 1.5 - fVar254 * fVar254 * auVar314._4_4_ * 0.5 * fVar254;
          fVar322 = fVar295 * 1.5 - fVar295 * fVar295 * auVar314._8_4_ * 0.5 * fVar295;
          fVar337 = fVar305 * 1.5 - fVar305 * fVar305 * auVar314._12_4_ * 0.5 * fVar305;
          fVar146 = fVar388 * fVar342 * auVar249._0_4_;
          fVar376 = fVar147 * fVar344 * auVar249._4_4_;
          fVar147 = fVar212 * fVar346 * auVar249._8_4_;
          fVar216 = fVar216 * fVar289 * auVar249._12_4_;
          fVar254 = -fVar317 * fVar342 * auVar249._0_4_;
          fVar295 = -fVar145 * fVar344 * auVar249._4_4_;
          fVar305 = -fVar214 * fVar346 * auVar249._8_4_;
          fVar317 = -fVar220 * fVar289 * auVar249._12_4_;
          fVar298 = fVar342 * 0.0 * auVar249._0_4_;
          fVar301 = fVar344 * 0.0 * auVar249._4_4_;
          fVar304 = fVar346 * 0.0 * auVar249._8_4_;
          fVar424 = fVar289 * 0.0 * auVar249._12_4_;
          fVar299 = fVar357 * fVar318 * auVar417._0_4_;
          fVar288 = fVar362 * fVar319 * auVar417._4_4_;
          fVar297 = fVar364 * fVar322 * auVar417._8_4_;
          fVar300 = fVar366 * fVar337 * auVar417._12_4_;
          fVar348 = fVar211 + fVar299;
          fVar353 = fVar218 + fVar288;
          fVar422 = fVar323 + fVar297;
          fVar427 = fVar332 + fVar300;
          fVar145 = -fVar429 * fVar318 * auVar417._0_4_;
          fVar214 = -fVar215 * fVar319 * auVar417._4_4_;
          fVar220 = -fVar287 * fVar322 * auVar417._8_4_;
          fVar252 = -fVar296 * fVar337 * auVar417._12_4_;
          fVar430 = fVar334 + fVar145;
          fVar431 = fVar302 + fVar214;
          fVar434 = fVar335 + fVar220;
          fVar435 = fVar320 + fVar252;
          fVar342 = fVar318 * 0.0 * auVar417._0_4_;
          fVar344 = fVar319 * 0.0 * auVar417._4_4_;
          fVar346 = fVar322 * 0.0 * auVar417._8_4_;
          fVar289 = fVar337 * 0.0 * auVar417._12_4_;
          fVar357 = fVar321 - fVar146;
          fVar362 = fVar336 - fVar376;
          fVar364 = fVar341 - fVar147;
          fVar366 = fVar343 - fVar216;
          fVar374 = fVar378 + fVar342;
          fVar388 = fVar379 + fVar344;
          fVar212 = fVar386 + fVar346;
          fVar256 = fVar387 + fVar289;
          fVar429 = fVar345 - fVar254;
          fVar215 = fVar351 - fVar295;
          fVar287 = fVar355 - fVar305;
          fVar296 = fVar426 - fVar317;
          fVar318 = fVar219 - fVar298;
          fVar319 = fVar221 - fVar301;
          fVar322 = fVar253 - fVar304;
          fVar337 = fVar255 - fVar424;
          uVar138 = -(uint)(0.0 < (fVar429 * (fVar374 - fVar318) - fVar318 * (fVar430 - fVar429)) *
                                  0.0 + (fVar318 * (fVar348 - fVar357) -
                                        (fVar374 - fVar318) * fVar357) * 0.0 +
                                        ((fVar430 - fVar429) * fVar357 -
                                        (fVar348 - fVar357) * fVar429));
          uVar140 = -(uint)(0.0 < (fVar215 * (fVar388 - fVar319) - fVar319 * (fVar431 - fVar215)) *
                                  0.0 + (fVar319 * (fVar353 - fVar362) -
                                        (fVar388 - fVar319) * fVar362) * 0.0 +
                                        ((fVar431 - fVar215) * fVar362 -
                                        (fVar353 - fVar362) * fVar215));
          uVar141 = -(uint)(0.0 < (fVar287 * (fVar212 - fVar322) - fVar322 * (fVar434 - fVar287)) *
                                  0.0 + (fVar322 * (fVar422 - fVar364) -
                                        (fVar212 - fVar322) * fVar364) * 0.0 +
                                        ((fVar434 - fVar287) * fVar364 -
                                        (fVar422 - fVar364) * fVar287));
          uVar142 = -(uint)(0.0 < (fVar296 * (fVar256 - fVar337) - fVar337 * (fVar435 - fVar296)) *
                                  0.0 + (fVar337 * (fVar427 - fVar366) -
                                        (fVar256 - fVar337) * fVar366) * 0.0 +
                                        ((fVar435 - fVar296) * fVar366 -
                                        (fVar427 - fVar366) * fVar296));
          fVar299 = (float)((uint)(fVar211 - fVar299) & uVar138 |
                           ~uVar138 & (uint)(fVar321 + fVar146));
          fVar321 = (float)((uint)(fVar218 - fVar288) & uVar140 |
                           ~uVar140 & (uint)(fVar336 + fVar376));
          fVar336 = (float)((uint)(fVar323 - fVar297) & uVar141 |
                           ~uVar141 & (uint)(fVar341 + fVar147));
          fVar332 = (float)((uint)(fVar332 - fVar300) & uVar142 |
                           ~uVar142 & (uint)(fVar343 + fVar216));
          fVar376 = (float)((uint)(fVar334 - fVar145) & uVar138 |
                           ~uVar138 & (uint)(fVar345 + fVar254));
          fVar351 = (float)((uint)(fVar302 - fVar214) & uVar140 |
                           ~uVar140 & (uint)(fVar351 + fVar295));
          fVar355 = (float)((uint)(fVar335 - fVar220) & uVar141 |
                           ~uVar141 & (uint)(fVar355 + fVar305));
          fVar426 = (float)((uint)(fVar320 - fVar252) & uVar142 |
                           ~uVar142 & (uint)(fVar426 + fVar317));
          fVar254 = (float)((uint)(fVar378 - fVar342) & uVar138 |
                           ~uVar138 & (uint)(fVar219 + fVar298));
          fVar295 = (float)((uint)(fVar379 - fVar344) & uVar140 |
                           ~uVar140 & (uint)(fVar221 + fVar301));
          fVar305 = (float)((uint)(fVar386 - fVar346) & uVar141 |
                           ~uVar141 & (uint)(fVar253 + fVar304));
          fVar317 = (float)((uint)(fVar387 - fVar289) & uVar142 |
                           ~uVar142 & (uint)(fVar255 + fVar424));
          fVar298 = (float)((uint)fVar357 & uVar138 | ~uVar138 & (uint)fVar348);
          fVar301 = (float)((uint)fVar362 & uVar140 | ~uVar140 & (uint)fVar353);
          fVar304 = (float)((uint)fVar364 & uVar141 | ~uVar141 & (uint)fVar422);
          fVar424 = (float)((uint)fVar366 & uVar142 | ~uVar142 & (uint)fVar427);
          fVar146 = (float)((uint)fVar429 & uVar138 | ~uVar138 & (uint)fVar430);
          fVar211 = (float)((uint)fVar215 & uVar140 | ~uVar140 & (uint)fVar431);
          fVar218 = (float)((uint)fVar287 & uVar141 | ~uVar141 & (uint)fVar434);
          fVar323 = (float)((uint)fVar296 & uVar142 | ~uVar142 & (uint)fVar435);
          fVar342 = (float)((uint)fVar318 & uVar138 | ~uVar138 & (uint)fVar374);
          fVar344 = (float)((uint)fVar319 & uVar140 | ~uVar140 & (uint)fVar388);
          fVar346 = (float)((uint)fVar322 & uVar141 | ~uVar141 & (uint)fVar212);
          fVar289 = (float)((uint)fVar337 & uVar142 | ~uVar142 & (uint)fVar256);
          fVar357 = (float)((uint)fVar348 & uVar138 | ~uVar138 & (uint)fVar357) - fVar299;
          fVar362 = (float)((uint)fVar353 & uVar140 | ~uVar140 & (uint)fVar362) - fVar321;
          fVar364 = (float)((uint)fVar422 & uVar141 | ~uVar141 & (uint)fVar364) - fVar336;
          fVar366 = (float)((uint)fVar427 & uVar142 | ~uVar142 & (uint)fVar366) - fVar332;
          fVar429 = (float)((uint)fVar430 & uVar138 | ~uVar138 & (uint)fVar429) - fVar376;
          fVar215 = (float)((uint)fVar431 & uVar140 | ~uVar140 & (uint)fVar215) - fVar351;
          fVar287 = (float)((uint)fVar434 & uVar141 | ~uVar141 & (uint)fVar287) - fVar355;
          fVar296 = (float)((uint)fVar435 & uVar142 | ~uVar142 & (uint)fVar296) - fVar426;
          fVar334 = (float)((uint)fVar374 & uVar138 | ~uVar138 & (uint)fVar318) - fVar254;
          fVar302 = (float)((uint)fVar388 & uVar140 | ~uVar140 & (uint)fVar319) - fVar295;
          fVar335 = (float)((uint)fVar212 & uVar141 | ~uVar141 & (uint)fVar322) - fVar305;
          fVar320 = (float)((uint)fVar256 & uVar142 | ~uVar142 & (uint)fVar337) - fVar317;
          fVar353 = fVar299 - fVar298;
          fVar422 = fVar321 - fVar301;
          fVar427 = fVar336 - fVar304;
          fVar430 = fVar332 - fVar424;
          fVar145 = fVar376 - fVar146;
          fVar214 = fVar351 - fVar211;
          fVar220 = fVar355 - fVar218;
          fVar252 = fVar426 - fVar323;
          fVar318 = fVar254 - fVar342;
          fVar319 = fVar295 - fVar344;
          fVar322 = fVar305 - fVar346;
          fVar337 = fVar317 - fVar289;
          fVar341 = (fVar376 * fVar334 - fVar254 * fVar429) * 0.0 +
                    (fVar254 * fVar357 - fVar299 * fVar334) * 0.0 +
                    (fVar299 * fVar429 - fVar376 * fVar357);
          fVar343 = (fVar351 * fVar302 - fVar295 * fVar215) * 0.0 +
                    (fVar295 * fVar362 - fVar321 * fVar302) * 0.0 +
                    (fVar321 * fVar215 - fVar351 * fVar362);
          auVar293._4_4_ = fVar343;
          auVar293._0_4_ = fVar341;
          fVar345 = (fVar355 * fVar335 - fVar305 * fVar287) * 0.0 +
                    (fVar305 * fVar364 - fVar336 * fVar335) * 0.0 +
                    (fVar336 * fVar287 - fVar355 * fVar364);
          fVar348 = (fVar426 * fVar320 - fVar317 * fVar296) * 0.0 +
                    (fVar317 * fVar366 - fVar332 * fVar320) * 0.0 +
                    (fVar332 * fVar296 - fVar426 * fVar366);
          auVar418._0_4_ =
               (fVar146 * fVar318 - fVar342 * fVar145) * 0.0 +
               (fVar342 * fVar353 - fVar298 * fVar318) * 0.0 +
               (fVar298 * fVar145 - fVar146 * fVar353);
          auVar418._4_4_ =
               (fVar211 * fVar319 - fVar344 * fVar214) * 0.0 +
               (fVar344 * fVar422 - fVar301 * fVar319) * 0.0 +
               (fVar301 * fVar214 - fVar211 * fVar422);
          auVar418._8_4_ =
               (fVar218 * fVar322 - fVar346 * fVar220) * 0.0 +
               (fVar346 * fVar427 - fVar304 * fVar322) * 0.0 +
               (fVar304 * fVar220 - fVar218 * fVar427);
          auVar418._12_4_ =
               (fVar323 * fVar337 - fVar289 * fVar252) * 0.0 +
               (fVar289 * fVar430 - fVar424 * fVar337) * 0.0 +
               (fVar424 * fVar252 - fVar323 * fVar430);
          auVar293._8_4_ = fVar345;
          auVar293._12_4_ = fVar348;
          auVar174 = maxps(auVar293,auVar418);
          bVar100 = auVar174._0_4_ <= 0.0 && bVar100;
          auVar294._0_4_ = -(uint)bVar100;
          bVar101 = auVar174._4_4_ <= 0.0 && bVar101;
          auVar294._4_4_ = -(uint)bVar101;
          bVar95 = auVar174._8_4_ <= 0.0 && bVar95;
          auVar294._8_4_ = -(uint)bVar95;
          bVar90 = auVar174._12_4_ <= 0.0 && bVar90;
          auVar294._12_4_ = -(uint)bVar90;
          iVar206 = movmskps((int)(bezier_basis1 + lVar129),auVar294);
          if (iVar206 == 0) {
LAB_0036a4a0:
            auVar282._8_8_ = uStack_390;
            auVar282._0_8_ = local_398;
          }
          else {
            fVar344 = fVar145 * fVar334 - fVar318 * fVar429;
            fVar346 = fVar214 * fVar302 - fVar319 * fVar215;
            fVar289 = fVar220 * fVar335 - fVar322 * fVar287;
            fVar298 = fVar252 * fVar320 - fVar337 * fVar296;
            fVar342 = fVar318 * fVar357 - fVar334 * fVar353;
            fVar319 = fVar319 * fVar362 - fVar302 * fVar422;
            fVar322 = fVar322 * fVar364 - fVar335 * fVar427;
            fVar337 = fVar337 * fVar366 - fVar320 * fVar430;
            fVar145 = fVar353 * fVar429 - fVar145 * fVar357;
            fVar357 = fVar422 * fVar215 - fVar214 * fVar362;
            fVar362 = fVar427 * fVar287 - fVar220 * fVar364;
            fVar301 = fVar430 * fVar296 - fVar252 * fVar366;
            auVar281._0_4_ = fVar342 * 0.0 + fVar145;
            auVar281._4_4_ = fVar319 * 0.0 + fVar357;
            auVar281._8_4_ = fVar322 * 0.0 + fVar362;
            auVar281._12_4_ = fVar337 * 0.0 + fVar301;
            auVar339._0_4_ = fVar344 * 0.0 + auVar281._0_4_;
            auVar339._4_4_ = fVar346 * 0.0 + auVar281._4_4_;
            auVar339._8_4_ = fVar289 * 0.0 + auVar281._8_4_;
            auVar339._12_4_ = fVar298 * 0.0 + auVar281._12_4_;
            auVar174 = rcpps(auVar281,auVar339);
            fVar214 = auVar174._0_4_;
            fVar220 = auVar174._4_4_;
            fVar252 = auVar174._8_4_;
            fVar318 = auVar174._12_4_;
            fVar214 = (1.0 - auVar339._0_4_ * fVar214) * fVar214 + fVar214;
            fVar220 = (1.0 - auVar339._4_4_ * fVar220) * fVar220 + fVar220;
            fVar252 = (1.0 - auVar339._8_4_ * fVar252) * fVar252 + fVar252;
            fVar318 = (1.0 - auVar339._12_4_ * fVar318) * fVar318 + fVar318;
            fVar254 = (fVar254 * fVar145 + fVar376 * fVar342 + fVar299 * fVar344) * fVar214;
            fVar295 = (fVar295 * fVar357 + fVar351 * fVar319 + fVar321 * fVar346) * fVar220;
            aVar384.v[1] = fVar295;
            aVar384.v[0] = fVar254;
            fVar305 = (fVar305 * fVar362 + fVar355 * fVar322 + fVar336 * fVar289) * fVar252;
            fVar317 = (fVar317 * fVar301 + fVar426 * fVar337 + fVar332 * fVar298) * fVar318;
            fVar145 = *(float *)(ray + k * 4 + 0x80);
            bVar100 = (fVar411 <= fVar254 && fVar254 <= fVar145) && bVar100;
            auVar315._0_4_ = -(uint)bVar100;
            bVar101 = (fVar411 <= fVar295 && fVar295 <= fVar145) && bVar101;
            auVar315._4_4_ = -(uint)bVar101;
            bVar95 = (fVar411 <= fVar305 && fVar305 <= fVar145) && bVar95;
            auVar315._8_4_ = -(uint)bVar95;
            bVar90 = (fVar411 <= fVar317 && fVar317 <= fVar145) && bVar90;
            auVar315._12_4_ = -(uint)bVar90;
            iVar206 = movmskps(iVar206,auVar315);
            if (iVar206 == 0) goto LAB_0036a4a0;
            auVar316._0_8_ =
                 CONCAT44(-(uint)(auVar339._4_4_ != 0.0 && bVar101),
                          -(uint)(auVar339._0_4_ != 0.0 && bVar100));
            auVar316._8_4_ = -(uint)(auVar339._8_4_ != 0.0 && bVar95);
            auVar316._12_4_ = -(uint)(auVar339._12_4_ != 0.0 && bVar90);
            iVar206 = movmskps(iVar206,auVar316);
            auVar282._8_8_ = uStack_390;
            auVar282._0_8_ = local_398;
            if (iVar206 != 0) {
              fVar341 = fVar341 * fVar214;
              fVar343 = fVar343 * fVar220;
              fVar345 = fVar345 * fVar252;
              fVar348 = fVar348 * fVar318;
              fVar389 = (float)((uint)(1.0 - fVar341) & uVar138 | ~uVar138 & (uint)fVar341);
              fVar333 = (float)((uint)(1.0 - fVar343) & uVar140 | ~uVar140 & (uint)fVar343);
              fVar402 = (float)((uint)(1.0 - fVar345) & uVar141 | ~uVar141 & (uint)fVar345);
              fVar340 = (float)((uint)(1.0 - fVar348) & uVar142 | ~uVar142 & (uint)fVar348);
              local_288 = (float)(~uVar138 & (uint)(auVar418._0_4_ * fVar214) |
                                 (uint)(1.0 - auVar418._0_4_ * fVar214) & uVar138);
              fStack_284 = (float)(~uVar140 & (uint)(auVar418._4_4_ * fVar220) |
                                  (uint)(1.0 - auVar418._4_4_ * fVar220) & uVar140);
              fStack_280 = (float)(~uVar141 & (uint)(auVar418._8_4_ * fVar252) |
                                  (uint)(1.0 - auVar418._8_4_ * fVar252) & uVar141);
              fStack_27c = (float)(~uVar142 & (uint)(auVar418._12_4_ * fVar318) |
                                  (uint)(1.0 - auVar418._12_4_ * fVar318) & uVar142);
              auVar282._8_4_ = auVar316._8_4_;
              auVar282._0_8_ = auVar316._0_8_;
              auVar282._12_4_ = auVar316._12_4_;
              aVar384.v[2] = fVar305;
              aVar384.v[3] = fVar317;
              aVar382 = aVar384;
            }
          }
          iVar206 = movmskps(iVar206,auVar282);
          if (iVar206 != 0) {
            fVar214 = (auVar417._0_4_ - auVar249._0_4_) * fVar389 + auVar249._0_4_;
            fVar220 = (auVar417._4_4_ - auVar249._4_4_) * fVar333 + auVar249._4_4_;
            fVar252 = (auVar417._8_4_ - auVar249._8_4_) * fVar402 + auVar249._8_4_;
            fVar254 = (auVar417._12_4_ - auVar249._12_4_) * fVar340 + auVar249._12_4_;
            fVar145 = *(float *)((long)local_3b0->ray_space + k * 4 + -0x10);
            aVar202._0_4_ = -(uint)(fVar145 * (fVar214 + fVar214) < aVar382.v[0]) & auVar282._0_4_;
            aVar202._4_4_ = -(uint)(fVar145 * (fVar220 + fVar220) < aVar382.v[1]) & auVar282._4_4_;
            aVar202._8_4_ = -(uint)(fVar145 * (fVar252 + fVar252) < aVar382.v[2]) & auVar282._8_4_;
            aVar202._12_4_ = -(uint)(fVar145 * (fVar254 + fVar254) < aVar382.v[3]) & auVar282._12_4_
            ;
            uVar138 = movmskps((int)local_3b0,(undefined1  [16])aVar202);
            if (uVar138 != 0) {
              local_288 = local_288 + local_288 + -1.0;
              fStack_284 = fStack_284 + fStack_284 + -1.0;
              fStack_280 = fStack_280 + fStack_280 + -1.0;
              fStack_27c = fStack_27c + fStack_27c + -1.0;
              bhit.U.field_0.v[1] = fVar333;
              bhit.U.field_0.v[0] = fVar389;
              bhit.U.field_0.v[2] = fVar402;
              bhit.U.field_0.v[3] = fVar340;
              bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fVar425,fVar399);
              bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fVar354,fVar352);
              bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fVar413,fVar412);
              bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fVar433,fVar414);
              bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fVar361,fVar356);
              bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fVar365,fVar363);
              bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fVar401,fVar400);
              bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fVar410,fVar403);
              pGVar26 = (context->scene->geometries).items[local_3a8].ptr;
              uVar131 = local_3a8;
              bhit.V.field_0.v[0] = local_288;
              bhit.V.field_0.v[1] = fStack_284;
              bhit.V.field_0.v[2] = fStack_280;
              bhit.V.field_0.v[3] = fStack_27c;
              bhit.T.field_0 = aVar382;
              bhit.i = uVar139;
              bhit.valid.field_0 = aVar202;
              if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar130 = (RTCIntersectArguments *)0x0;
                bhit.N = iVar285;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (pRVar130 = (RTCIntersectArguments *)
                                  CONCAT71((int7)((ulong)context->args >> 8),1), bhit.N = iVar285,
                      pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar145 = (float)(int)uVar139;
                bhit.vu.field_0.v[0] = (fVar145 + fVar389 + 0.0) * local_98;
                bhit.vu.field_0.v[1] = (fVar145 + fVar333 + 1.0) * fStack_94;
                bhit.vu.field_0.v[2] = (fVar145 + fVar402 + 2.0) * fStack_90;
                bhit.vu.field_0.v[3] = (fVar145 + fVar340 + 3.0) * fStack_8c;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_284,local_288);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_27c,fStack_280);
                bhit.vt.field_0 = aVar382;
                uVar131 = (ulong)(uVar138 & 0xff);
                uVar135 = 0;
                if (uVar131 != 0) {
                  for (; ((uVar138 & 0xff) >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                  }
                }
                auVar174 = *local_340;
                bhit.N = iVar285;
                while (uVar131 != 0) {
                  local_f8 = bhit.vu.field_0.v[uVar135];
                  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_e8 = bhit.vv.field_0.v[uVar135];
                  *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar135];
                  fVar145 = 1.0 - local_f8;
                  fVar220 = local_f8 * fVar145 + local_f8 * fVar145;
                  fVar252 = (fVar220 - local_f8 * local_f8) * 3.0;
                  fVar214 = local_f8 * local_f8 * 3.0;
                  fVar220 = (fVar145 * fVar145 - fVar220) * 3.0;
                  args.context = context->user;
                  fVar145 = fVar145 * fVar145 * -3.0;
                  local_128 = fVar145 * fVar399 +
                              fVar220 * fVar412 + fVar252 * fVar356 + fVar214 * fVar400;
                  local_118 = fVar145 * fVar425 +
                              fVar220 * fVar413 + fVar252 * fVar361 + fVar214 * fVar401;
                  local_108 = fVar145 * fVar352 +
                              fVar220 * fVar414 + fVar252 * fVar363 + fVar214 * fVar403;
                  fStack_124 = local_128;
                  fStack_120 = local_128;
                  fStack_11c = local_128;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  local_d8 = CONCAT44(uStack_84,local_88);
                  uStack_d0 = CONCAT44(uStack_7c,uStack_80);
                  local_c8 = CONCAT44(uStack_74,local_78);
                  uStack_c0 = CONCAT44(uStack_6c,uStack_70);
                  local_b8 = (args.context)->instID[0];
                  uStack_b4 = local_b8;
                  uStack_b0 = local_b8;
                  uStack_ac = local_b8;
                  local_a8 = (args.context)->instPrimID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  args.valid = (int *)local_3c8;
                  pRVar130 = (RTCIntersectArguments *)pGVar26->userPtr;
                  args.hit = (RTCHitN *)&local_128;
                  args.N = 4;
                  p_Var127 = pGVar26->occlusionFilterN;
                  local_3c8 = auVar174;
                  args.geometryUserPtr = pRVar130;
                  args.ray = (RTCRayN *)ray;
                  if (p_Var127 != (RTCFilterFunctionN)0x0) {
                    p_Var127 = (RTCFilterFunctionN)(*p_Var127)(&args);
                  }
                  auVar250._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                  auVar250._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                  auVar250._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                  auVar250._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                  uVar138 = movmskps((int)p_Var127,auVar250);
                  pRVar128 = (RTCRayN *)(ulong)(uVar138 ^ 0xf);
                  if ((uVar138 ^ 0xf) == 0) {
                    auVar250 = auVar250 ^ _DAT_01f46b70;
                  }
                  else {
                    pRVar130 = context->args;
                    if ((pRVar130->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar130->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar130->filter)(&args);
                    }
                    auVar203._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                    auVar203._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                    auVar203._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                    auVar203._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                    auVar250 = auVar203 ^ _DAT_01f46b70;
                    *(undefined1 (*) [16])(args.ray + 0x80) =
                         ~auVar203 & _DAT_01f45a40 |
                         *(undefined1 (*) [16])(args.ray + 0x80) & auVar203;
                    pRVar128 = args.ray;
                  }
                  auVar251._0_4_ = auVar250._0_4_ << 0x1f;
                  auVar251._4_4_ = auVar250._4_4_ << 0x1f;
                  auVar251._8_4_ = auVar250._8_4_ << 0x1f;
                  auVar251._12_4_ = auVar250._12_4_ << 0x1f;
                  iVar206 = movmskps((int)pRVar128,auVar251);
                  if (iVar206 != 0) {
                    pRVar130 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar130 >> 8),1);
                    goto LAB_0036a48b;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar133;
                  uVar131 = uVar131 ^ 1L << (uVar135 & 0x3f);
                  uVar135 = 0;
                  if (uVar131 != 0) {
                    for (; (uVar131 >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                    }
                  }
                }
                pRVar130 = (RTCIntersectArguments *)0x0;
              }
LAB_0036a48b:
              bVar136 = bVar136 | (byte)pRVar130;
            }
          }
        }
      }
    }
    if (bVar136 != 0) break;
    fVar411 = *(float *)(ray + k * 4 + 0x80);
    auVar248._4_4_ = -(uint)(fStack_44 <= fVar411);
    auVar248._0_4_ = -(uint)(local_48 <= fVar411);
    auVar248._8_4_ = -(uint)(fStack_40 <= fVar411);
    auVar248._12_4_ = -(uint)(fStack_3c <= fVar411);
    uVar138 = movmskps(uVar133,auVar248);
  }
  return uVar134 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }